

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessBr
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ErrorCode EVar2;
  pointer pbVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined4 uVar6;
  string *psVar7;
  value_t vVar8;
  json_value jVar9;
  char *pcVar10;
  Status SVar11;
  __type_conflict1 _Var12;
  int iVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  char *pcVar18;
  ulong uVar19;
  reference aJson;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var20;
  Value *pVVar21;
  int *piVar22;
  event_base *event_base;
  event *ev;
  event *ev_00;
  __normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
  _Var23;
  element_type *peVar24;
  ssize_t sVar25;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  _Var26;
  event_base **__args;
  char *pcVar27;
  _Alloc_hider *p_Var28;
  undefined1 *puVar29;
  _Alloc_hider _Var30;
  _Base_ptr p_Var31;
  undefined8 uVar32;
  uchar *puVar33;
  element_type *peVar34;
  Interpreter *pIVar35;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  aVar36;
  undefined8 uVar37;
  _Base_ptr p_Var38;
  element_type *peVar39;
  undefined1 auVar40 [8];
  __normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
  __last;
  pointer pBVar41;
  string *psVar42;
  string *psVar43;
  pointer pbVar44;
  undefined1 *puVar45;
  pointer aValue;
  uchar *puVar46;
  _Alloc_hider *p_Var47;
  bool bVar48;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  anon_class_16_2_ec85c428_for__M_pred __pred;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  string_view fmt_07;
  string_view fmt_08;
  string_view fmt_09;
  string_view fmt_10;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  format_args args_07;
  format_args args_08;
  format_args args_09;
  format_args args_10;
  format_args args_11;
  format_args args_12;
  format_args args_13;
  format_args args_14;
  format_args args_15;
  format_args args_16;
  format_args args_17;
  format_args args_18;
  format_args args_19;
  format_args args_20;
  format_args args_21;
  format_args args_22;
  format_args args_23;
  format_args args_24;
  format_args args_25;
  json ba;
  StringArray unresolved;
  string netIf;
  vector<unsigned_long,_std::allocator<unsigned_long>_> xpans;
  BorderRouterId brId;
  FDGuard fdgMdnsSocket;
  thread selectThread;
  StringArray unresolved_1;
  uint32_t scanTimeout;
  vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
  borderAgents;
  json json;
  json baJson;
  event_base *base;
  char mdnsSendBuffer [16384];
  undefined1 local_48b8 [8];
  json_value jStack_48b0;
  undefined1 local_48a8 [24];
  _Alloc_hider _Stack_4890;
  parse_func local_4888;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4880;
  undefined1 local_4868 [8];
  pointer pbStack_4860;
  undefined1 local_4858 [24];
  Interpreter *local_4840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4828;
  BorderAgent *local_4818;
  string *local_4810;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4808;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_47f8;
  string local_47e8;
  FDGuard local_47c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_47c0;
  vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_> local_47b8;
  uint local_479c;
  undefined1 local_4798 [8];
  json_value jStack_4790;
  pointer local_4788;
  undefined1 local_4778 [8];
  json_value jStack_4770;
  undefined1 local_4768 [8];
  json_value local_4760;
  undefined1 local_4758 [32];
  undefined1 local_4738 [32];
  undefined4 local_4718;
  pointer local_4710;
  pointer local_4708;
  undefined1 local_4700 [32];
  element_type *local_46e0;
  undefined1 local_46d8 [24];
  _Alloc_hider local_46c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_46b8;
  undefined1 local_46b0 [24];
  element_type *local_4698;
  undefined1 local_4690 [24];
  int local_4678;
  element_type *local_4670;
  _Alloc_hider local_4668;
  undefined1 local_4660 [80];
  undefined1 local_4610 [16];
  undefined1 local_4600 [8];
  json_value local_45f8;
  undefined4 local_45f0;
  pointer local_45e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_45e0;
  undefined1 local_45c8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_45a8;
  uchar local_4598 [16];
  undefined1 local_4588 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4568;
  char local_4558 [16];
  undefined4 local_4548;
  element_type *local_4540;
  _Alloc_hider local_4538;
  undefined1 local_4530 [32];
  size_type local_4510;
  undefined1 local_4508 [24];
  element_type *local_44f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_44e8;
  undefined1 local_44e0 [24];
  _Base_ptr local_44c8;
  _Base_ptr local_44c0;
  undefined1 local_44b8 [24];
  _Base_ptr local_44a0;
  _Base_ptr local_4498;
  undefined1 local_4490 [24];
  undefined1 *local_4478;
  _Base_ptr local_4470;
  undefined1 local_4468 [16];
  undefined4 local_4458;
  undefined1 *local_4450;
  Timestamp local_4448;
  undefined1 local_4440 [16];
  undefined4 local_4430;
  undefined1 *local_4428;
  _Alloc_hider local_4420;
  undefined1 local_4418 [24];
  undefined1 *local_4400;
  _Alloc_hider local_43f8;
  undefined1 local_43f0 [24];
  uchar *local_43d8;
  pointer local_43d0;
  uchar local_43c8 [16];
  undefined4 local_43b8;
  uchar *local_43b0;
  pointer local_43a8;
  uchar local_43a0 [16];
  undefined4 local_4390;
  uchar *local_4388;
  pointer local_4380;
  uchar local_4378 [16];
  undefined4 local_4368;
  uchar *local_4360;
  pointer local_4358;
  uchar local_4350 [16];
  undefined4 local_4340;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4338;
  uchar local_4328 [16];
  undefined4 local_4318;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4310;
  uchar local_4300 [56];
  undefined4 local_42c8;
  element_type *local_42c0;
  pointer local_42b8;
  undefined1 local_42b0 [104];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_4248;
  pointer local_4240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4238;
  undefined1 local_4228 [16];
  _Alloc_hider local_4218;
  _Alloc_hider local_4210 [2];
  undefined1 local_4200 [16];
  _Alloc_hider local_41f0;
  _Alloc_hider local_41e8 [3];
  _Alloc_hider local_41d0;
  size_type local_41c8;
  char local_41c0 [16];
  undefined4 local_41b0;
  undefined1 *local_41a8;
  long local_41a0;
  undefined1 local_4198 [16];
  undefined4 local_4188;
  undefined1 *local_4180;
  long local_4178;
  undefined1 local_4170 [16];
  undefined4 local_4160;
  undefined1 *local_4158;
  long local_4150;
  undefined1 local_4148 [16];
  _Any_data local_4138;
  code *local_4128;
  undefined8 uStack_4120;
  string local_4110;
  Error local_40f0;
  string_t local_40c8;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_40a8;
  string local_4098;
  string_t local_4078;
  undefined1 local_4058 [8];
  _Alloc_hider _Stack_4050;
  undefined1 local_4048 [24];
  _Alloc_hider local_4030;
  pointer local_4028;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_4020 [1023];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  local_4818 = (BorderAgent *)&(__return_storage_ptr__->mError).mMessage;
  paVar17 = &(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p = (pointer)paVar17;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  paVar1 = &(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_dataplus._M_p = (pointer)paVar1;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar44 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_4840 = this;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar44) < 0x21) {
    local_48b8 = (undefined1  [8])((ulong)local_48b8 & 0xffffffff00000000);
    jStack_48b0.object = (object_t *)0x228fa9;
    local_48a8._0_8_ = (pointer)0x11;
    local_48a8._8_8_ = 0;
    _Stack_4890._M_p = (pointer)0x0;
    pcVar27 = "too few arguments";
    local_48a8._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_48b8;
    do {
      pcVar18 = pcVar27 + 1;
      if (*pcVar27 == '}') {
        if ((pcVar18 == "") || (*pcVar18 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar18 = pcVar27 + 2;
      }
      else if (*pcVar27 == '{') {
        pcVar18 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar27,"",(format_string_checker<char> *)local_48b8);
      }
      pcVar27 = pcVar18;
    } while (pcVar18 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_48b8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_4868,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    local_4160 = 2;
    local_4158 = local_4148;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4158,local_4868,
               (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
    local_4058._0_4_ = local_4160;
    _Stack_4050._M_p = (pointer)(local_4048 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_4050,local_4158,local_4158 + local_4150);
    local_4028 = (pointer)0x0;
    local_4020[0]._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
    local_4030._M_p = (pointer)local_4020;
    std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mData,(string *)&local_4030);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4030._M_p != local_4020) {
      operator_delete(local_4030._M_p);
    }
    if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
      operator_delete(_Stack_4050._M_p);
    }
    if (local_4158 != local_4148) {
      operator_delete(local_4158);
    }
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4858;
    _Var30._M_p = (pointer)local_4868;
LAB_0011d213:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var30._M_p == paVar17) {
      return __return_storage_ptr__;
    }
    goto LAB_0011d21c;
  }
  pbStack_4860 = (pointer)0x4;
  local_4858._0_5_ = 0x7473696c;
  local_4868 = (undefined1  [8])local_4858;
  local_4810 = (string *)&__return_storage_ptr__->mData;
  local_4660._72_8_ = paVar1;
  local_4610._0_8_ = paVar17;
  utils::ToLower((string *)local_4058,pbVar44 + 1);
  utils::ToLower((string *)local_48b8,(string *)local_4868);
  if ((object_t *)_Stack_4050._M_p == jStack_48b0.object) {
    if ((pointer)_Stack_4050._M_p == (pointer)0x0) {
      bVar48 = true;
    }
    else {
      iVar13 = bcmp((void *)local_4058,(void *)local_48b8,(size_t)_Stack_4050._M_p);
      bVar48 = iVar13 == 0;
    }
  }
  else {
    bVar48 = false;
  }
  if (local_48b8 != (undefined1  [8])local_48a8) {
    operator_delete((void *)local_48b8);
  }
  if (local_4058 != (undefined1  [8])local_4048) {
    operator_delete((void *)local_4058);
  }
  if (local_4868 != (undefined1  [8])local_4858) {
    operator_delete((void *)local_4868);
  }
  if (bVar48) {
    local_4798 = (undefined1  [8])((ulong)local_4798 & 0xffffffffffffff00);
    jStack_4790.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4798);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4798);
    local_47e8.field_2._M_allocated_capacity = 0;
    local_47e8._M_dataplus._M_p = (pointer)0x0;
    local_47e8._M_string_length = 0;
    local_4828._M_allocated_capacity = 0;
    local_4838._0_8_ = 0;
    local_4838._8_8_ = 0;
    if ((long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(aExpr->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start == 0x40) {
      pbVar44 = (local_4840->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 = (local_4840->mContext).mDomAliases.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (pbVar3 == pbVar44) {
        if ((local_4840->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish ==
            (local_4840->mContext).mNwkAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          SVar11 = persistent_storage::Registry::GetAllBorderRouters
                             ((local_4840->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(BorderRouterArray *)&local_47e8);
          if (kNotFound < SVar11) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_05.field_1.args_ = in_R9.args_;
            args_05.desc_ = (unsigned_long_long)local_4868;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_48b8,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_05
                      );
            local_41e8[2]._M_p._0_4_ = 0x12;
            local_41d0._M_p = local_41c0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_41d0,local_48b8,
                       (char *)((long)local_48b8 + (long)jStack_48b0));
            local_4058._0_4_ = local_41e8[2]._M_p._0_4_;
            _Stack_4050._M_p = local_4048 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4050,local_41d0._M_p,local_41d0._M_p + local_41c8);
            local_4030._M_p = (pointer)local_4020;
            local_4028 = (pointer)0x0;
            local_4020[0]._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_4058);
            Value::~Value((Value *)local_4058);
            if (local_41d0._M_p != local_41c0) {
              operator_delete(local_41d0._M_p);
            }
            local_4078._M_dataplus._M_p = (pointer)local_48b8;
            if (local_48b8 == (undefined1  [8])local_48a8) goto LAB_0011de32;
            goto LAB_0011de2d;
          }
        }
        else {
          local_4868 = (undefined1  [8])0x0;
          pbStack_4860 = (pointer)0x0;
          local_4858._0_8_ = 0;
          SVar11 = persistent_storage::Registry::GetNetworksByAliases
                             ((local_4840->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(StringArray *)local_4840,(NetworkArray *)&local_4838,
                              (StringArray *)local_4868);
          if (SVar11 != kSuccess) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)&local_4808;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_48b8,(v10 *)"lookup failed",(string_view)ZEXT816(0xd),args_01
                      );
            local_41b0._0_2_ = 0x12;
            local_41b0._2_2_ = 0;
            local_41a8 = local_4198;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_41a8,local_48b8,
                       (char *)((long)local_48b8 + (long)jStack_48b0));
            local_4058._0_4_ = local_41b0;
            _Stack_4050._M_p = local_4048 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4050,local_41a8,local_41a8 + local_41a0);
            local_4030._M_p = (pointer)local_4020;
            local_4028 = (pointer)0x0;
            local_4020[0]._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_4058);
            Value::~Value((Value *)local_4058);
            if (local_41a8 != local_4198) {
              operator_delete(local_41a8);
            }
            if (local_48b8 != (undefined1  [8])local_48a8) {
              operator_delete((void *)local_48b8);
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_4868);
            goto LAB_0011de32;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4868);
        }
      }
      else {
        do {
          local_4058 = (undefined1  [8])0x0;
          _Stack_4050._M_p = (pointer)0x0;
          local_4048._0_8_ = 0;
          SVar11 = persistent_storage::Registry::GetNetworksInDomain
                             ((local_4840->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,pbVar44,
                              (vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                               *)local_4058);
          if (SVar11 == kSuccess) {
            std::
            vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::Network*,std::vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>>>
                      ((vector<ot::commissioner::persistent_storage::Network,std::allocator<ot::commissioner::persistent_storage::Network>>
                        *)&local_4838,local_4838._8_8_,local_4058,_Stack_4050._M_p);
          }
          else {
            local_4568._M_allocated_capacity = (size_type)local_4558;
            pcVar4 = (pbVar44->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4568,pcVar4,pcVar4 + pbVar44->_M_string_length);
            local_48b8 = (undefined1  [8])0x13;
            pIVar35 = (Interpreter *)local_4738;
            local_4738._0_8_ = (pointer)(local_4738 + 0x10);
            local_4738._0_8_ =
                 std::__cxx11::string::_M_create((ulong *)local_4738,(ulong)local_48b8);
            local_4738._16_8_ = local_48b8;
            (((pointer)local_4738._0_8_)->_M_dataplus)._M_p = (pointer)0x6e206e69616d6f64;
            ((pointer)local_4738._0_8_)->_M_string_length = 0x6e6b6e7520656d61;
            *(undefined4 *)((long)&((pointer)local_4738._0_8_)->_M_string_length + 7) = 0x6e776f6e;
            local_4738._8_8_ = local_48b8;
            *(char *)((long)&(((pointer)local_4738._0_8_)->_M_dataplus)._M_p + (long)local_48b8) =
                 '\0';
            PrintNetworkMessage(pIVar35,(string *)&local_4568,(string *)local_4738,kYellow);
            if ((pointer)local_4738._0_8_ != (pointer)(local_4738 + 0x10)) {
              operator_delete((void *)local_4738._0_8_);
            }
            if ((char *)local_4568._M_allocated_capacity != local_4558) {
              operator_delete((void *)local_4568._M_allocated_capacity);
            }
          }
          std::
          vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
          ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
                     *)local_4058);
          pbVar44 = pbVar44 + 1;
        } while (pbVar44 != pbVar3);
      }
      uVar32 = local_4838._8_8_;
      if (local_4838._8_8_ != local_4838._0_8_) {
        uVar37 = local_4838._0_8_;
        do {
          local_4058 = (undefined1  [8])0x0;
          _Stack_4050._M_p = (pointer)0x0;
          local_4048._0_8_ = 0;
          pIVar35 = (Interpreter *)
                    (local_4840->mRegistry).
                    super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                    ._M_ptr;
          SVar11 = persistent_storage::Registry::GetBorderRoutersInNetwork
                             ((Registry *)pIVar35,*(uint64_t *)(uVar37 + 0x28),
                              (vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                               *)local_4058);
          if (SVar11 == kSuccess) {
            std::
            vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>
            ::
            _M_range_insert<__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>>
                      ((vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>
                        *)&local_47e8,local_47e8._M_string_length,local_4058,_Stack_4050._M_p);
          }
          else {
            local_4578._8_5_ = 0x64656c6961;
            local_4578._M_allocated_capacity._0_5_ = 0x756b6f6f6c;
            local_4578._M_allocated_capacity._5_3_ = 0x662070;
            local_4588._8_8_ = (pointer)0xd;
            local_4578._M_local_buf[0xd] = '\0';
            local_4588._0_8_ = &local_4578;
            PrintNetworkMessage(pIVar35,*(uint64_t *)(uVar37 + 0x28),(string *)local_4588,kYellow);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4588._0_8_ != &local_4578) {
              operator_delete((void *)local_4588._0_8_);
            }
          }
          std::
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                     *)local_4058);
          uVar37 = uVar37 + 0x60;
        } while (uVar37 != uVar32);
      }
      if ((pointer)local_47e8._M_string_length == local_47e8._M_dataplus._M_p) {
        local_4098.field_2._M_allocated_capacity._0_2_ = 0x5d5b;
        local_4098._M_string_length = 2;
        local_4098.field_2._M_local_buf[2] = '\0';
        local_4098._M_dataplus._M_p = (pointer)&local_4098.field_2;
        Value::Value((Value *)local_4058,&local_4098);
        psVar7 = local_4810;
        (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
        std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
        std::__cxx11::string::operator=(psVar7,(string *)&local_4030);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4030._M_p != local_4020) {
          operator_delete(local_4030._M_p);
        }
        if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
          operator_delete(_Stack_4050._M_p);
        }
        local_4078._M_dataplus._M_p = local_4098._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4098._M_dataplus._M_p == &local_4098.field_2) goto LAB_0011de32;
      }
      else {
        local_45f8.object = (object_t *)0x0;
        local_4600[0] = array;
        local_4058 = (undefined1  [8])local_47e8._M_dataplus._M_p;
        local_48b8 = (undefined1  [8])local_47e8._M_string_length;
        local_45f8.object =
             (object_t *)
             nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::
             create<std::vector<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>,std::allocator<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_const*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>,__gnu_cxx::__normal_iterator<ot::commissioner::persistent_storage::BorderRouter_const*,std::vector<ot::commissioner::persistent_storage::BorderRouter,std::allocator<ot::commissioner::persistent_storage::BorderRouter>>>>
                       ((__normal_iterator<const_ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                         *)local_4058,
                        (__normal_iterator<const_ot::commissioner::persistent_storage::BorderRouter_*,_std::vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>_>
                         *)local_48b8);
        psVar7 = local_4810;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4600);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4600);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4600);
        jVar9 = jStack_4790;
        vVar8 = local_4798[0];
        local_4798[0] = local_4600[0];
        local_4600[0] = vVar8;
        jStack_4790.string = local_45f8.string;
        local_45f8 = jVar9;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4798);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4600);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_4600 + 8),local_4600[0]);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::dump(&local_4078,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                *)local_4798,4,' ',false,strict);
        Value::Value((Value *)local_4058,&local_4078);
        (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
        std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
        std::__cxx11::string::operator=(psVar7,(string *)&local_4030);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4030._M_p != local_4020) {
          operator_delete(local_4030._M_p);
        }
        if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
          operator_delete(_Stack_4050._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4078._M_dataplus._M_p == &local_4078.field_2) goto LAB_0011de32;
      }
    }
    else {
      local_48b8 = (undefined1  [8])((ulong)local_48b8 & 0xffffffff00000000);
      jStack_48b0.object = (object_t *)0x22a77d;
      local_48a8._0_8_ = (pointer)0x12;
      local_48a8._8_8_ = 0;
      _Stack_4890._M_p = (pointer)0x0;
      pcVar27 = "too many arguments";
      local_48a8._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_48b8;
      do {
        pcVar18 = pcVar27 + 1;
        if (*pcVar27 == '}') {
          if ((pcVar18 == "") || (*pcVar18 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar18 = pcVar27 + 2;
        }
        else if (*pcVar27 == '{') {
          pcVar18 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar27,"",(format_string_checker<char> *)local_48b8);
        }
        pcVar27 = pcVar18;
      } while (pcVar18 != "");
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)local_48b8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4868,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_00
                );
      local_4188 = 2;
      local_4180 = local_4170;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4180,local_4868,
                 (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
      local_4058._0_4_ = local_4188;
      _Stack_4050._M_p = (pointer)(local_4048 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_4050,local_4180,local_4180 + local_4178);
      local_4028 = (pointer)0x0;
      local_4020[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
      local_4030._M_p = (pointer)local_4020;
      std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
      std::__cxx11::string::operator=(local_4810,(string *)&local_4030);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4030._M_p != local_4020) {
        operator_delete(local_4030._M_p);
      }
      if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
        operator_delete(_Stack_4050._M_p);
      }
      if (local_4180 != local_4170) {
        operator_delete(local_4180);
      }
      local_4078._M_dataplus._M_p = (pointer)local_4868;
      if (local_4868 == (undefined1  [8])local_4858) goto LAB_0011de32;
    }
LAB_0011de2d:
    operator_delete(local_4078._M_dataplus._M_p);
LAB_0011de32:
    std::
    vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
    ::~vector((vector<ot::commissioner::persistent_storage::Network,_std::allocator<ot::commissioner::persistent_storage::Network>_>
               *)&local_4838);
    std::
    vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
    ::~vector((vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
               *)&local_47e8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_4798);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::json_value::destroy((json_value *)(local_4798 + 8),local_4798[0]);
    return __return_storage_ptr__;
  }
  local_4858._0_4_ = 0x646461;
  pbStack_4860 = (pointer)0x3;
  local_4868 = (undefined1  [8])local_4858;
  utils::ToLower((string *)local_4058,
                 (aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1);
  utils::ToLower((string *)local_48b8,(string *)local_4868);
  if ((object_t *)_Stack_4050._M_p == jStack_48b0.object) {
    if ((pointer)_Stack_4050._M_p == (pointer)0x0) {
      bVar48 = true;
    }
    else {
      iVar13 = bcmp((void *)local_4058,(void *)local_48b8,(size_t)_Stack_4050._M_p);
      bVar48 = iVar13 == 0;
    }
  }
  else {
    bVar48 = false;
  }
  if (local_48b8 != (undefined1  [8])local_48a8) {
    operator_delete((void *)local_48b8);
  }
  if (local_4058 != (undefined1  [8])local_4048) {
    operator_delete((void *)local_4058);
  }
  if (local_4868 != (undefined1  [8])local_4858) {
    operator_delete((void *)local_4868);
  }
  if (!bVar48) {
    pbStack_4860 = (pointer)0x6;
    local_4858._0_7_ = 0x6574656c6564;
    local_4868 = (undefined1  [8])local_4858;
    utils::ToLower((string *)local_4058,
                   (aExpr->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 1);
    utils::ToLower((string *)local_48b8,(string *)local_4868);
    if ((object_t *)_Stack_4050._M_p == jStack_48b0.object) {
      if ((pointer)_Stack_4050._M_p == (pointer)0x0) {
        bVar48 = true;
      }
      else {
        iVar13 = bcmp((void *)local_4058,(void *)local_48b8,(size_t)_Stack_4050._M_p);
        bVar48 = iVar13 == 0;
      }
    }
    else {
      bVar48 = false;
    }
    if (local_48b8 != (undefined1  [8])local_48a8) {
      operator_delete((void *)local_48b8);
    }
    if (local_4058 != (undefined1  [8])local_4048) {
      operator_delete((void *)local_4058);
    }
    if (local_4868 != (undefined1  [8])local_4858) {
      operator_delete((void *)local_4868);
    }
    pIVar35 = local_4840;
    if (bVar48) {
      uVar19 = (long)(aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
      if (uVar19 < 0x61) {
        if (uVar19 != 0x60) {
          if ((local_4840->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (local_4840->mContext).mNwkAliases.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            psVar42 = (local_4840->mContext).mDomAliases.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            if ((local_4840->mContext).mDomAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish == psVar42) {
              return __return_storage_ptr__;
            }
            local_4868 = (undefined1  [8])0x0;
            pbStack_4860 = (pointer)0x0;
            local_4858._0_8_ = 0;
            SVar11 = persistent_storage::Registry::DeleteBorderRoutersInDomain
                               ((local_4840->mRegistry).
                                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,psVar42);
            if (SVar11 != kSuccess) {
              if (SVar11 == kRestricted) {
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                          ();
                pbVar44 = (pIVar35->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_47e8._M_dataplus._M_p = (pbVar44->_M_dataplus)._M_p;
                local_47e8._M_string_length = pbVar44->_M_string_length;
                fmt_01.size_ = 0xd;
                fmt_01.data_ = (char *)0x49;
                args_10.field_1.values_ = in_R9.values_;
                args_10.desc_ = (unsigned_long_long)&local_47e8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_48b8,
                           (v10 *)
                           "Failed to delete border routers in the domain \'{}\' of the current network"
                           ,fmt_01,args_10);
                local_43b8 = 0x12;
                puVar46 = local_43a0;
                local_43b0 = puVar46;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_43b0,local_48b8,
                           (char *)((long)local_48b8 + (long)jStack_48b0));
                local_4058._0_4_ = local_43b8;
                _Stack_4050._M_p = local_4048 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&_Stack_4050,local_43b0,local_43b0 + (long)local_43a8);
                local_4030._M_p = (pointer)local_4020;
                local_4028 = (pointer)0x0;
                local_4020[0]._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_4058);
                Value::~Value((Value *)local_4058);
                puVar33 = local_43b0;
              }
              else {
                ::fmt::v10::detail::
                check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                          ();
                pbVar44 = (pIVar35->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                local_47e8._M_dataplus._M_p = (pbVar44->_M_dataplus)._M_p;
                local_47e8._M_string_length = pbVar44->_M_string_length;
                fmt_09.size_ = 0xd;
                fmt_09.data_ = (char *)0x32;
                args_22.field_1.values_ = in_R9.values_;
                args_22.desc_ = (unsigned_long_long)&local_47e8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_48b8,
                           (v10 *)"Failed to delete border routers in the domain \'{}\'",fmt_09,
                           args_22);
                local_43f0._16_4_ = 0x12;
                puVar46 = local_43c8;
                local_43d8 = puVar46;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_43d8,local_48b8,
                           (char *)((long)local_48b8 + (long)jStack_48b0));
                local_4058._0_4_ = local_43f0._16_4_;
                _Stack_4050._M_p = local_4048 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&_Stack_4050,local_43d8,local_43d8 + (long)local_43d0);
                local_4030._M_p = (pointer)local_4020;
                local_4028 = (pointer)0x0;
                local_4020[0]._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_4058);
                Value::~Value((Value *)local_4058);
                puVar33 = local_43d8;
              }
              if (puVar33 != puVar46) {
                operator_delete(puVar33);
              }
              if (local_48b8 != (undefined1  [8])local_48a8) {
                operator_delete((void *)local_48b8);
              }
            }
          }
          else {
            local_4868 = (undefined1  [8])0x0;
            pbStack_4860 = (pointer)0x0;
            local_4858._0_8_ = 0;
            SVar11 = persistent_storage::Registry::DeleteBorderRoutersInNetworks
                               ((local_4840->mRegistry).
                                super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,(StringArray *)local_4840,(StringArray *)local_4868);
            if (SVar11 != kSuccess) {
              if (SVar11 == kRestricted) {
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_06.field_1.values_ = in_R9.values_;
                args_06.desc_ = (unsigned_long_long)&local_47e8;
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_48b8,
                           (v10 *)"Can\'t delete all border routers from the current network",
                           (string_view)ZEXT816(0x38),args_06);
                local_4368 = 0x12;
                puVar46 = local_4350;
                local_4360 = puVar46;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4360,local_48b8,
                           (char *)((long)local_48b8 + (long)jStack_48b0));
                local_4058._0_4_ = local_4368;
                _Stack_4050._M_p = local_4048 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&_Stack_4050,local_4360,local_4360 + (long)local_4358);
                local_4030._M_p = (pointer)local_4020;
                local_4028 = (pointer)0x0;
                local_4020[0]._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_4058);
                Value::~Value((Value *)local_4058);
                puVar33 = local_4360;
              }
              else {
                local_48b8 = (undefined1  [8])local_48a8;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_48b8,"Failed to delete border routers","");
                local_4390 = 0xb;
                puVar46 = local_4378;
                local_4388 = puVar46;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4388,local_48b8,
                           (char *)((long)local_48b8 + (long)jStack_48b0));
                local_4058._0_4_ = local_4390;
                _Stack_4050._M_p = local_4048 + 8;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&_Stack_4050,local_4388,local_4388 + (long)local_4380);
                local_4030._M_p = (pointer)local_4020;
                local_4028 = (pointer)0x0;
                local_4020[0]._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_4058);
                Value::~Value((Value *)local_4058);
                puVar33 = local_4388;
              }
              if (puVar33 != puVar46) {
                operator_delete(puVar33);
              }
              if (local_48b8 != (undefined1  [8])local_48a8) {
                operator_delete((void *)local_48b8);
              }
            }
            pbVar44 = pbStack_4860;
            if (local_4868 != (undefined1  [8])pbStack_4860) {
              auVar40 = local_4868;
              do {
                pcVar4 = (((pointer)auVar40)->_M_dataplus)._M_p;
                local_4110._M_dataplus._M_p = (pointer)&local_4110.field_2;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_4110,pcVar4,
                           pcVar4 + ((pointer)auVar40)->_M_string_length);
                local_4058 = (undefined1  [8])0x11;
                pIVar35 = (Interpreter *)local_4758;
                local_4758._0_8_ = (pointer)(local_4758 + 0x10);
                local_4758._0_8_ =
                     std::__cxx11::string::_M_create((ulong *)local_4758,(ulong)local_4058);
                local_4758._16_8_ = local_4058;
                (((pointer)local_4758._0_8_)->_M_dataplus)._M_p = (pointer)0x742064656c696166;
                ((pointer)local_4758._0_8_)->_M_string_length = 0x766c6f736572206f;
                (((pointer)local_4758._0_8_)->field_2)._M_local_buf[0] = 'e';
                local_4758._8_8_ = local_4058;
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_4058)->_M_local_buf[(long)&((pointer)local_4758._0_8_)->_M_dataplus] =
                     '\0';
                PrintNetworkMessage(pIVar35,&local_4110,(string *)local_4758,kYellow);
                if ((pointer)local_4758._0_8_ != (pointer)(local_4758 + 0x10)) {
                  operator_delete((void *)local_4758._0_8_);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_4110._M_dataplus._M_p != &local_4110.field_2) {
                  operator_delete(local_4110._M_dataplus._M_p);
                }
                auVar40 = (undefined1  [8])((long)auVar40 + 0x20);
              } while (auVar40 != (undefined1  [8])pbVar44);
            }
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_4868);
          return __return_storage_ptr__;
        }
        if (((local_4840->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (local_4840->mContext).mNwkAliases.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((local_4840->mContext).mDomAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            (local_4840->mContext).mDomAliases.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)&local_47e8);
          uVar16 = std::__cxx11::stoi((aExpr->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_start + 2,(size_t *)0x0,
                                      10);
          pIVar35 = local_4840;
          persistent_storage::BorderRouterId::BorderRouterId((BorderRouterId *)local_4058,uVar16);
          local_47e8._M_dataplus._M_p._0_4_ = local_4058._0_4_;
          SVar11 = persistent_storage::Registry::DeleteBorderRouterById
                             ((pIVar35->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,(BorderRouterId *)&local_47e8);
          if (SVar11 == kSuccess) {
            return __return_storage_ptr__;
          }
          if (SVar11 == kRestricted) {
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar44 = (aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_4868 = (undefined1  [8])pbVar44[2]._M_dataplus._M_p;
            pbStack_4860 = (pointer)pbVar44[2]._M_string_length;
            fmt_08.size_ = 0xd;
            fmt_08.data_ = (char *)0x48;
            args_20.field_1.values_ = in_R9.values_;
            args_20.desc_ = (unsigned_long_long)local_4868;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_48b8,
                       (v10 *)
                       "Failed to delete border router ID {}: last router in the current network",
                       fmt_08,args_20);
            local_4318 = 0x12;
            puVar46 = local_4300;
            local_4310._M_allocated_capacity = (size_type)puVar46;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4310,local_48b8,
                       (char *)((long)local_48b8 + (long)jStack_48b0));
            local_4058._0_4_ = local_4318;
            _Stack_4050._M_p = local_4048 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4050,local_4310._M_allocated_capacity,
                       (uchar *)(local_4310._M_allocated_capacity + local_4310._8_8_));
            local_4030._M_p = (pointer)local_4020;
            local_4028 = (pointer)0x0;
            local_4020[0]._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_4058);
            Value::~Value((Value *)local_4058);
            uVar32 = local_4310._M_allocated_capacity;
          }
          else {
            ::fmt::v10::detail::
            check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                      ();
            pbVar44 = (aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            local_4868 = (undefined1  [8])pbVar44[2]._M_dataplus._M_p;
            pbStack_4860 = (pointer)pbVar44[2]._M_string_length;
            fmt_10.size_ = 0xd;
            fmt_10.data_ = (char *)0x24;
            args_24.field_1.values_ = in_R9.values_;
            args_24.desc_ = (unsigned_long_long)local_4868;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_48b8,(v10 *)"Failed to delete border router ID {}",fmt_10,
                       args_24);
            local_4340 = 0x12;
            puVar46 = local_4328;
            local_4338._M_allocated_capacity = (size_type)puVar46;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4338,local_48b8,
                       (char *)((long)local_48b8 + (long)jStack_48b0));
            local_4058._0_4_ = local_4340;
            _Stack_4050._M_p = local_4048 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4050,local_4338._M_allocated_capacity,
                       (uchar *)(local_4338._M_allocated_capacity + local_4338._8_8_));
            local_4030._M_p = (pointer)local_4020;
            local_4028 = (pointer)0x0;
            local_4020[0]._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_4058);
            Value::~Value((Value *)local_4058);
            uVar32 = local_4338._M_allocated_capacity;
          }
          if ((uchar *)uVar32 != puVar46) {
            operator_delete((void *)uVar32);
          }
          _Var30._M_p = (pointer)local_48b8;
          if (local_48b8 == (undefined1  [8])local_48a8) {
            return __return_storage_ptr__;
          }
          goto LAB_0011d21c;
        }
      }
      local_48b8 = (undefined1  [8])((ulong)local_48b8 & 0xffffffff00000000);
      pcVar27 = "Too many arguments for `br delete` command`";
      jStack_48b0.object = (object_t *)0x22d02c;
      local_48a8._0_8_ = (pointer)0x2b;
      local_48a8._8_8_ = 0;
      _Stack_4890._M_p = (pointer)0x0;
      local_48a8._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_48b8;
      local_47e8._M_dataplus._M_p = (pointer)local_48b8;
      do {
        if (pcVar27 == "") break;
        pcVar18 = pcVar27;
        if (*pcVar27 == '{') {
LAB_0011e1bc:
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_47e8,pcVar27,pcVar18);
          pcVar27 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar18,"",(format_string_checker<char> *)local_48b8);
          bVar48 = true;
        }
        else {
          pcVar18 = pcVar27 + 1;
          bVar48 = pcVar18 != "";
          if (bVar48) {
            if (*pcVar18 != '{') {
              pcVar10 = pcVar27 + 2;
              do {
                pcVar18 = pcVar10;
                bVar48 = pcVar18 != "";
                if (pcVar18 == "") goto LAB_0011e1b8;
                pcVar10 = pcVar18 + 1;
              } while (*pcVar18 != '{');
            }
            bVar48 = true;
          }
LAB_0011e1b8:
          if (bVar48) goto LAB_0011e1bc;
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer::
          operator()((writer *)&local_47e8,pcVar27,"");
          bVar48 = false;
        }
      } while (bVar48);
      args_04.field_1.values_ = in_R9.values_;
      args_04.desc_ = (unsigned_long_long)local_48b8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4868,(v10 *)"Too many arguments for `br delete` command`",
                 (string_view)ZEXT816(0x2b),args_04);
      local_42c8 = 2;
      peVar39 = (element_type *)local_42b0;
      local_42c0 = peVar39;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_42c0,local_4868,
                 (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
      local_4058._0_4_ = local_42c8;
      _Stack_4050._M_p = (pointer)(local_4048 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_4050,local_42c0,
                 local_42b8 +
                 (long)&(local_42c0->super_CommissionerHandler)._vptr_CommissionerHandler);
      local_4028 = (pointer)0x0;
      local_4020[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
      local_4030._M_p = (pointer)local_4020;
      std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
      std::__cxx11::string::operator=(local_4810,(string *)&local_4030);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4030._M_p != local_4020) {
        operator_delete(local_4030._M_p);
      }
      peVar34 = local_42c0;
      if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
        operator_delete(_Stack_4050._M_p);
        peVar34 = local_42c0;
      }
    }
    else {
      pbStack_4860 = (pointer)0x4;
      local_4858._0_5_ = 0x6e616373;
      local_4868 = (undefined1  [8])local_4858;
      utils::ToLower((string *)local_4058,
                     (aExpr->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 1);
      utils::ToLower((string *)local_48b8,(string *)local_4868);
      if ((object_t *)_Stack_4050._M_p == jStack_48b0.object) {
        if ((pointer)_Stack_4050._M_p == (pointer)0x0) {
          bVar48 = true;
        }
        else {
          iVar13 = bcmp((void *)local_4058,(void *)local_48b8,(size_t)_Stack_4050._M_p);
          bVar48 = iVar13 == 0;
        }
      }
      else {
        bVar48 = false;
      }
      if (local_48b8 != (undefined1  [8])local_48a8) {
        operator_delete((void *)local_48b8);
      }
      if (local_4058 != (undefined1  [8])local_4048) {
        operator_delete((void *)local_4058);
      }
      if (local_4868 != (undefined1  [8])local_4858) {
        operator_delete((void *)local_4868);
      }
      if (bVar48) {
        local_47e8._M_dataplus._M_p = (pointer)&local_47e8.field_2;
        local_4058 = (undefined1  [8])0x13;
        local_47e8._M_dataplus._M_p =
             (pointer)std::__cxx11::string::_M_create((ulong *)&local_47e8,(ulong)local_4058);
        local_47e8.field_2._M_allocated_capacity = (size_type)local_4058;
        *(undefined8 *)local_47e8._M_dataplus._M_p = 0x706f636873656d5f;
        (((parse_context_type *)(local_47e8._M_dataplus._M_p + 8))->
        super_basic_format_parse_context<char>).format_str_.data_ = (char *)0x6f6c2e7064755f2e;
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_47e8._M_dataplus._M_p + 0xf) = 'o';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_47e8._M_dataplus._M_p + 0x10) = 'c';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_47e8._M_dataplus._M_p + 0x11) = 'a';
        *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_47e8._M_dataplus._M_p + 0x12) = 'l';
        local_47e8._M_string_length = (size_type)local_4058;
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_4058)->_M_local_buf[(long)local_47e8._M_dataplus._M_p] = '\0';
        local_479c = 10000;
        local_4838._M_allocated_capacity = (size_type)&local_4828;
        local_4838._8_8_ = (undefined1 *)0x0;
        local_4828._M_allocated_capacity = local_4828._M_allocated_capacity & 0xffffffffffffff00;
        local_47c4.mFD = -1;
        local_47c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)0x0;
        local_4788 = (pointer)0x0;
        local_4798 = (undefined1  [8])0x0;
        jStack_4790.object = (object_t *)0x0;
        local_4768[0] = null;
        local_4760.object = (object_t *)0x0;
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4768);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4768);
        _Var20 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[10]>>
                           ((local_4840->mContext).mCommandKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (local_4840->mContext).mCommandKeys.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,"--timeout");
        pbVar5 = (local_4840->mContext).mCommandKeys.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (_Var20._M_current == pbVar5) {
LAB_0011e9d0:
          pIVar35 = local_4840;
          _Var20 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const[8]>>
                             ((local_4840->mContext).mCommandKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                              (local_4840->mContext).mCommandKeys.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,"--netif");
          pbVar5 = (pIVar35->mContext).mCommandKeys.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (_Var20._M_current != pbVar5) {
            if (_Var20._M_current + 1 == pbVar5) {
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_13.field_1.args_ = in_R9.args_;
              args_13.desc_ = (unsigned_long_long)&local_4808;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4868,(v10 *)"Missing --netif value",
                         (string_view)ZEXT816(0x15),args_13);
              local_4430 = 2;
              puVar45 = local_4418;
              local_4428 = puVar45;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_4428,local_4868,
                         (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
              local_48b8._0_4_ = local_4430;
              jStack_48b0.object = (object_t *)(local_48a8 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&jStack_48b0,local_4428,local_4428 + (long)local_4420._M_p);
              _Stack_4890._M_p = (pointer)&local_4880;
              local_4888 = (parse_func)0x0;
              local_4880._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
              Value::~Value((Value *)local_48b8);
              puVar29 = local_4428;
              goto LAB_0011f28a;
            }
            std::__cxx11::string::_M_assign((string *)local_4838._M_local_buf);
          }
          iVar13 = mdns_socket_open_ipv4();
          if (iVar13 < 0) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_12.field_1.values_ = in_R9.values_;
            args_12.desc_ = (unsigned_long_long)&local_4808;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4868,(v10 *)"failed to open mDNS IPv4 socket",
                       (string_view)ZEXT816(0x1f),args_12);
            local_4458 = 0xb;
            puVar45 = local_4440;
            local_4450 = puVar45;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4450,local_4868,
                       (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
            local_48b8._0_4_ = local_4458;
            jStack_48b0.object = (object_t *)(local_48a8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&jStack_48b0,local_4450,local_4450 + (long)local_4448);
            _Stack_4890._M_p = (pointer)&local_4880;
            local_4888 = (parse_func)0x0;
            local_4880._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
            Value::~Value((Value *)local_48b8);
            puVar29 = local_4450;
LAB_0011f28a:
            if (puVar29 != puVar45) {
              operator_delete(puVar29);
            }
            uVar32 = local_4868;
            if (local_4868 != (undefined1  [8])local_4858) goto LAB_0011f29e;
            goto LAB_0011f2a3;
          }
          if (((undefined1 *)local_4838._8_8_ != (undefined1 *)0x0) &&
             (iVar14 = setsockopt(iVar13,1,0x19,(void *)local_4838._0_8_,(socklen_t)local_4838._8_8_
                                 ), iVar14 != 0)) {
            ::fmt::v10::detail::
            check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_char_*,_FMT_COMPILE_STRING,_0>
                      ();
            piVar22 = __errno_location();
            local_4858._0_8_ = strerror(*piVar22);
            local_4868 = (undefined1  [8])local_4838._0_8_;
            pbStack_4860 = (pointer)local_4838._8_8_;
            fmt.size_ = 0xcd;
            fmt.data_ = (char *)0x27;
            args_07.field_1.args_ = in_R9.args_;
            args_07.desc_ = (unsigned_long_long)local_4868;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_4808,(v10 *)"failed to bind network interface {}: {}",fmt,
                       args_07);
            local_4490._16_4_ = 2;
            local_4478 = local_4468;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4478,local_4808._0_8_,
                       (char *)(local_4808._8_8_ + local_4808._M_allocated_capacity));
            local_48b8._0_4_ = local_4490._16_4_;
            jStack_48b0.object = (object_t *)(local_48a8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&jStack_48b0,local_4478,local_4478 + (long)local_4470);
            _Stack_4890._M_p = (pointer)&local_4880;
            local_4888 = (parse_func)0x0;
            local_4880._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
            Value::~Value((Value *)local_48b8);
            if (local_4478 != local_4468) {
              operator_delete(local_4478);
            }
            uVar32 = local_4808._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4808._0_8_ == &local_47f8) goto LAB_0011f2a3;
LAB_0011f29e:
            operator_delete((void *)uVar32);
            goto LAB_0011f2a3;
          }
          local_47c4.mFD = iVar13;
          event_base = event_base_new();
          local_4778 = (undefined1  [8])((ulong)local_479c / 1000);
          jStack_4770._0_4_ = (local_479c % 1000) * 1000;
          jStack_4770.number_integer._4_4_ = 0;
          local_4610._8_8_ = event_base;
          event_base_loopexit(event_base,(timeval *)local_4778);
          ev = event_new(event_base,iVar13,0x12,ProcessBr::anon_class_1_0_00000001::__invoke,
                         local_4798);
          event_add(ev,(timeval *)0x0);
          ev_00 = event_new(event_base,local_4840->mCancelPipe[0],0x12,
                            ProcessBr::anon_class_1_0_00000001::__invoke,event_base);
          event_add(ev_00,(timeval *)0x0);
          std::thread::
          thread<ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__35,event_base*&,void>
                    ((thread *)local_48b8,
                     (anon_class_1_0_00000001_for__M_head_impl *)(local_4610 + 8),__args);
          if (local_47c0 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) goto LAB_001213b7;
          local_47c0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)local_48b8;
          aVar36 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
                    )0x4000;
          iVar13 = mdns_query_send(iVar13,MDNS_RECORDTYPE_PTR,local_47e8._M_dataplus._M_p,
                                   local_47e8._M_string_length,local_4058,0x4000);
          if (iVar13 == 0) {
            std::thread::join();
            if (((local_4840->mCancelCommand)._M_base._M_i & 1U) != 0) {
              do {
                sVar25 = read(local_4840->mCancelPipe[0],&local_47b8,4);
              } while (sVar25 != -1);
              ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
              args_21.field_1.args_ = aVar36.args_;
              args_21.desc_ = (unsigned_long_long)&local_4808;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)local_4868,(v10 *)"Scan cancelled by user",
                         (string_view)ZEXT816(0x16),args_21);
              local_44e0._16_4_ = _S_black;
              p_Var38 = (_Base_ptr)local_44b8;
              local_44c8 = p_Var38;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_44c8,local_4868,
                         (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
              local_48b8._0_4_ = local_44e0._16_4_;
              jStack_48b0.object = (object_t *)(local_48a8 + 8);
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&jStack_48b0,local_44c8,
                         (pointer)((long)&local_44c0->_M_color + (long)&local_44c8->_M_color));
              _Stack_4890._M_p = (pointer)&local_4880;
              local_4888 = (parse_func)0x0;
              local_4880._M_local_buf[0] = '\0';
              Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
              Value::~Value((Value *)local_48b8);
              p_Var31 = local_44c8;
              goto LAB_001202bb;
            }
            local_4808._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_4808._8_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_47f8._M_allocated_capacity = 0;
            local_47b8.
            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_47b8.
            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
            ._M_impl.super__Vector_impl_data._M_start = (BorderAgent *)0x0;
            local_47b8.
            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
            ._M_impl.super__Vector_impl_data._M_finish = (BorderAgent *)0x0;
            if ((local_4840->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start ==
                (local_4840->mContext).mNwkAliases.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
LAB_001206dd:
              jVar9 = jStack_4790;
              if (local_4798 != (undefined1  [8])jStack_4790.object) {
                psVar42 = &((Error *)((long)local_4798 + 0x178))->mMessage;
                do {
                  if (*(int *)((long)&psVar42[-1].field_2 + 8) == 0) {
                    local_48b8 = (undefined1  [8])((ulong)local_48b8 & 0xffffffffffffff00);
                    jStack_48b0.object = (object_t *)0x0;
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                        *)local_48b8);
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                        *)local_48b8);
                    BorderAgentToJson((BorderAgent *)(psVar42 + -0xc),
                                      (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                       *)local_48b8);
                    if (((((local_4840->mContext).mNwkAliases.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start ==
                           (local_4840->mContext).mNwkAliases.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish) &&
                         ((local_4840->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start ==
                          (local_4840->mContext).mDomAliases.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish)) ||
                        ((pbVar5 = (local_4840->mContext).mDomAliases.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,
                         pbVar5 != (local_4840->mContext).mDomAliases.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish &&
                         (((psVar42[-1].field_2._M_local_buf[1] & 0x10U) != 0 &&
                          (_Var12 = std::operator==(psVar42 + -3,pbVar5), _Var12)))))) ||
                       (((local_4840->mContext).mNwkAliases.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start !=
                         (local_4840->mContext).mNwkAliases.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish &&
                        (((psVar42[-1].field_2._M_local_buf[0] & 0x20U) != 0 &&
                         (_Var26 = std::
                                   __find_if<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_equals_val<unsigned_long_const>>
                                             (local_4808._0_8_,local_4808._8_8_,&psVar42[-8].field_2
                                             ),
                         _Var26._M_current != (unsigned_long *)local_4808._8_8_)))))) {
                      nlohmann::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      ::push_back((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                   *)local_4768,
                                  (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                   *)local_48b8);
                    }
                    nlohmann::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                                   *)local_48b8);
                  }
                  else {
                    Console::Write(psVar42,kRed);
                  }
                  psVar43 = psVar42 + 1;
                  psVar42 = psVar42 + 0xd;
                } while (psVar43 != (string *)jVar9.object);
              }
              nlohmann::
              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
              ::dump(&local_40c8,
                     (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_4768,4,' ',false,strict);
              Value::Value((Value *)local_48b8,&local_40c8);
              Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
              Value::~Value((Value *)local_48b8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_40c8._M_dataplus._M_p != &local_40c8.field_2) goto LAB_00120863;
            }
            else {
              SVar11 = persistent_storage::Registry::GetNetworkXpansByAliases
                                 ((local_4840->mRegistry).
                                  super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr,(StringArray *)local_4840,
                                  (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                  &local_4808,(StringArray *)&local_47b8);
              if (SVar11 == kSuccess) {
                local_4818 = local_47b8.
                             super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                             ._M_impl.super__Vector_impl_data._M_finish;
                if (local_47b8.
                    super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                    ._M_impl.super__Vector_impl_data._M_start !=
                    local_47b8.
                    super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
                  pBVar41 = local_47b8.
                            super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                            ._M_impl.super__Vector_impl_data._M_start;
                  do {
                    local_45a8._M_allocated_capacity = (size_type)local_4598;
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_45a8,pBVar41->_vptr_BorderAgent,
                               (pBVar41->mAddr)._M_dataplus._M_p + (long)pBVar41->_vptr_BorderAgent)
                    ;
                    local_45c8._0_8_ = local_45c8 + 0x10;
                    pIVar35 = (Interpreter *)local_45c8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_45c8,"failed to resolve","");
                    PrintNetworkMessage(pIVar35,(string *)&local_45a8,(string *)local_45c8,kYellow);
                    if ((pointer)local_45c8._0_8_ != (pointer)(local_45c8 + 0x10)) {
                      operator_delete((void *)local_45c8._0_8_);
                    }
                    if ((uchar *)local_45a8._M_allocated_capacity != local_4598) {
                      operator_delete((void *)local_45a8._M_allocated_capacity);
                    }
                    pBVar41 = (pointer)((pBVar41->mAddr).field_2._M_local_buf + 8);
                  } while (pBVar41 != local_4818);
                }
                if (local_4808._0_8_ != local_4808._8_8_) goto LAB_001206dd;
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_25.field_1.values_ = aVar36.values_;
                args_25.desc_ = (unsigned_long_long)(local_4660 + 0x38);
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4868,
                           (v10 *)
                           "No known extended PAN ID discovered for network aliases. Please make complete rescan."
                           ,(string_view)ZEXT816(0x55),args_25);
                local_4530._16_4_ = 5;
                peVar39 = (element_type *)local_4508;
                local_4530._24_8_ = peVar39;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)(local_4530 + 0x18),local_4868,
                           (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
                local_48b8._0_4_ = local_4530._16_4_;
                jStack_48b0.object = (object_t *)(local_48a8 + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&jStack_48b0,local_4530._24_8_,
                           (pointer)(local_4510 + local_4530._24_8_));
                _Stack_4890._M_p = (pointer)&local_4880;
                local_4888 = (parse_func)0x0;
                local_4880._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
                Value::~Value((Value *)local_48b8);
                peVar34 = (element_type *)local_4530._24_8_;
              }
              else {
                ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
                args_23.field_1.values_ = aVar36.values_;
                args_23.desc_ = (unsigned_long_long)(local_4660 + 0x38);
                ::fmt::v10::vformat_abi_cxx11_
                          ((string *)local_4868,
                           (v10 *)"Failed to convert network aliases to XPAN IDs",
                           (string_view)ZEXT816(0x2d),args_23);
                local_4508._16_4_ = 0x12;
                peVar39 = (element_type *)local_44e0;
                local_44f0 = peVar39;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_44f0,local_4868,
                           (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
                local_48b8._0_4_ = local_4508._16_4_;
                jStack_48b0.object = (object_t *)(local_48a8 + 8);
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&jStack_48b0,local_44f0,
                           (pointer)((long)&(local_44f0->super_CommissionerHandler).
                                            _vptr_CommissionerHandler +
                                    (long)&(local_44e8._M_pi)->_vptr__Sp_counted_base));
                _Stack_4890._M_p = (pointer)&local_4880;
                local_4888 = (parse_func)0x0;
                local_4880._M_local_buf[0] = '\0';
                Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
                Value::~Value((Value *)local_48b8);
                peVar34 = local_44f0;
              }
              if (peVar34 != peVar39) {
                operator_delete(peVar34);
              }
              local_40c8._M_dataplus._M_p = (pointer)local_4868;
              if (local_4868 != (undefined1  [8])local_4858) {
LAB_00120863:
                operator_delete(local_40c8._M_dataplus._M_p);
              }
            }
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_47b8);
            uVar32 = local_4808._0_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4808._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) goto LAB_001202d3;
          }
          else {
            event_base_loopbreak(event_base);
            std::thread::join();
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_11.field_1.args_ = aVar36.args_;
            args_11.desc_ = (unsigned_long_long)&local_4808;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4868,(v10 *)"Sending mDNS query failed",
                       (string_view)ZEXT816(0x19),args_11);
            local_44b8._16_4_ = 0xb;
            p_Var38 = (_Base_ptr)local_4490;
            local_44a0 = p_Var38;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_44a0,local_4868,
                       (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
            local_48b8._0_4_ = local_44b8._16_4_;
            jStack_48b0.object = (object_t *)(local_48a8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&jStack_48b0,local_44a0,
                       (pointer)((long)&local_4498->_M_color + (long)&local_44a0->_M_color));
            _Stack_4890._M_p = (pointer)&local_4880;
            local_4888 = (parse_func)0x0;
            local_4880._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
            Value::~Value((Value *)local_48b8);
            p_Var31 = local_44a0;
LAB_001202bb:
            if (p_Var31 != p_Var38) {
              operator_delete(p_Var31);
            }
            uVar32 = local_4868;
            if (local_4868 != (undefined1  [8])local_4858) {
LAB_001202d3:
              operator_delete((void *)uVar32);
            }
          }
        }
        else {
          if (_Var20._M_current + 1 == pbVar5) {
            ::fmt::v10::detail::check_format_string<FMT_COMPILE_STRING,_0>();
            args_09.field_1.values_ = in_R9.values_;
            args_09.desc_ = (unsigned_long_long)&local_4808;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)local_4868,(v10 *)"Missing --timeout value",
                       (string_view)ZEXT816(0x17),args_09);
            local_4418._16_4_ = 2;
            puVar45 = local_43f0;
            local_4400 = puVar45;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4400,local_4868,
                       (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
            local_48b8._0_4_ = local_4418._16_4_;
            jStack_48b0.object = (object_t *)(local_48a8 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&jStack_48b0,local_4400,local_4400 + (long)local_43f8._M_p);
            _Stack_4890._M_p = (pointer)&local_4880;
            local_4888 = (parse_func)0x0;
            local_4880._M_local_buf[0] = '\0';
            Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
            Value::~Value((Value *)local_48b8);
            puVar29 = local_4400;
            goto LAB_0011f28a;
          }
          utils::ParseInteger<unsigned_int>(&local_40f0,&local_479c,_Var20._M_current + 1);
          local_48b8._0_4_ = local_40f0.mCode;
          jStack_48b0.object = (object_t *)(local_48a8 + 8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&jStack_48b0,local_40f0.mMessage._M_dataplus._M_p,
                     local_40f0.mMessage._M_dataplus._M_p + local_40f0.mMessage._M_string_length);
          _Stack_4890._M_p = (pointer)&local_4880;
          local_4888 = (parse_func)0x0;
          local_4880._M_local_buf[0] = '\0';
          pVVar21 = Value::operator=(__return_storage_ptr__,(Value *)local_48b8);
          EVar2 = (pVVar21->mError).mCode;
          Value::~Value((Value *)local_48b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40f0.mMessage._M_dataplus._M_p != &local_40f0.mMessage.field_2) {
            operator_delete(local_40f0.mMessage._M_dataplus._M_p);
          }
          if (EVar2 == kNone) goto LAB_0011e9d0;
LAB_0011f2a3:
          ev_00 = (event *)0x0;
          ev = (event *)0x0;
        }
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                            *)local_4768);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::json_value::destroy((json_value *)(local_4768 + 8),local_4768[0]);
        std::
        vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
        ::~vector((vector<ot::commissioner::BorderAgentOrErrorMsg,_std::allocator<ot::commissioner::BorderAgentOrErrorMsg>_>
                   *)local_4798);
        if (ev_00 != (event *)0x0) {
          event_free(ev_00);
        }
        if (ev != (event *)0x0) {
          event_free(ev);
        }
        if (local_47c0 !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
LAB_001213b7:
          std::terminate();
        }
        anon_unknown_34::FDGuard::~FDGuard(&local_47c4);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4838._0_8_ != &local_4828) {
          operator_delete((void *)local_4838._0_8_);
        }
        paVar17 = &local_47e8.field_2;
        _Var30._M_p = local_47e8._M_dataplus._M_p;
        goto LAB_0011d213;
      }
      local_48b8._0_4_ = 0xd;
      jStack_48b0.object = (object_t *)0x22a6cc;
      local_48a8._0_8_ = (pointer)0x1f;
      local_48a8._8_8_ = 0x100000000;
      _Stack_4890._M_p =
           (pointer)::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar27 = "\'{}\' is not a valid sub-command";
      local_48a8._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_48b8;
      do {
        pcVar18 = pcVar27 + 1;
        if (*pcVar27 == '}') {
          if ((pcVar18 == "") || (*pcVar18 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar18 = pcVar27 + 2;
        }
        else if (*pcVar27 == '{') {
          pcVar18 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                              (pcVar27,"",(format_string_checker<char> *)local_48b8);
        }
        pcVar27 = pcVar18;
      } while (pcVar18 != "");
      pbVar44 = (aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_48b8 = (undefined1  [8])pbVar44[1]._M_dataplus._M_p;
      jStack_48b0 = (json_value)pbVar44[1]._M_string_length;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1f;
      args_08.field_1.args_ = in_R9.args_;
      args_08.desc_ = (unsigned_long_long)local_48b8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)local_4868,(v10 *)"\'{}\' is not a valid sub-command",fmt_00,args_08);
      local_4548 = 3;
      peVar39 = (element_type *)local_4530;
      local_4540 = peVar39;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4540,local_4868,
                 (char *)((long)local_4868 + (long)&pbStack_4860->_M_dataplus));
      local_4058._0_4_ = local_4548;
      _Stack_4050._M_p = (pointer)(local_4048 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_4050,local_4540,local_4538._M_p + (long)local_4540);
      local_4028 = (pointer)0x0;
      local_4020[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
      local_4030._M_p = (pointer)local_4020;
      std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
      std::__cxx11::string::operator=(local_4810,(string *)&local_4030);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4030._M_p != local_4020) {
        operator_delete(local_4030._M_p);
      }
      peVar34 = local_4540;
      if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
        operator_delete(_Stack_4050._M_p);
        peVar34 = local_4540;
      }
    }
    if (peVar34 != peVar39) {
      operator_delete(peVar34);
    }
    _Var30._M_p = (pointer)local_4868;
    if (local_4868 == (undefined1  [8])local_4858) {
      return __return_storage_ptr__;
    }
    goto LAB_0011d21c;
  }
  pbStack_4860 = (pointer)(local_4858 + 8);
  local_4868 = (undefined1  [8])((ulong)local_4868 & 0xffffffff00000000);
  local_4858._0_8_ = (char *)0x0;
  local_4858[8] = '\0';
  local_47e8._M_dataplus._M_p = (pointer)&local_47e8.field_2;
  local_47e8._M_string_length = 0;
  local_47e8.field_2._M_allocated_capacity =
       local_47e8.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_4778 = (undefined1  [8])((ulong)local_4778 & 0xffffffffffffff00);
  jStack_4770.object = (object_t *)0x0;
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_4778);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_4778);
  psVar7 = local_4810;
  local_47b8.
  super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_47b8.
  super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>.
  _M_impl.super__Vector_impl_data._M_start = (BorderAgent *)0x0;
  local_47b8.
  super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>.
  _M_impl.super__Vector_impl_data._M_finish = (BorderAgent *)0x0;
  pbVar44 = (aExpr->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  uVar19 = (long)(aExpr->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar44;
  if (uVar19 < 0x41) {
    local_48b8 = (undefined1  [8])((ulong)(uint)local_48b8._4_4_ << 0x20);
    jStack_48b0.object = (object_t *)0x22a829;
    local_48a8._0_8_ = (pointer)0x1d;
    local_48a8._8_8_ = 0;
    _Stack_4890._M_p = (pointer)0x0;
    pcVar27 = "input JSON file path required";
    local_48a8._16_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)local_48b8;
    do {
      pcVar18 = pcVar27 + 1;
      if (*pcVar27 == '}') {
        if ((pcVar18 == "") || (*pcVar18 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar18 = pcVar27 + 2;
      }
      else if (*pcVar27 == '{') {
        pcVar18 = ::fmt::v10::detail::
                  parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                            (pcVar27,"",(format_string_checker<char> *)local_48b8);
      }
      pcVar27 = pcVar18;
    } while (pcVar18 != "");
    args_02.field_1.values_ = in_R9.values_;
    args_02.desc_ = (unsigned_long_long)local_48b8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_4838,(v10 *)"input JSON file path required",
               (string_view)ZEXT816(0x1d),args_02);
    local_4200._0_4_ = 2;
    p_Var47 = local_41e8;
    local_4200._8_8_ = p_Var47;
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_4200 + 8),local_4838._0_8_,
               (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
    local_4058._0_4_ = local_4200._0_4_;
    _Stack_4050._M_p = (pointer)(local_4048 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)&_Stack_4050,local_4200._8_8_,local_41f0._M_p + local_4200._8_8_);
    local_4028 = (pointer)0x0;
    local_4020[0]._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
    local_4030._M_p = (pointer)local_4020;
    std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
    std::__cxx11::string::operator=(psVar7,(string *)&local_4030);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4030._M_p != local_4020) {
      operator_delete(local_4030._M_p);
    }
    p_Var28 = (_Alloc_hider *)local_4200._8_8_;
    if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
      operator_delete(_Stack_4050._M_p);
      p_Var28 = (_Alloc_hider *)local_4200._8_8_;
    }
LAB_0011dffc:
    if (p_Var28 != p_Var47) {
      operator_delete(p_Var28);
    }
    uVar32 = local_4838._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4838._0_8_ != &local_4828) {
LAB_0011e017:
      operator_delete((void *)uVar32);
    }
LAB_0011e01c:
    uVar16 = 0;
  }
  else {
    if (uVar19 != 0x60) {
      local_48b8 = (undefined1  [8])((ulong)(uint)local_48b8._4_4_ << 0x20);
      jStack_48b0.object = (object_t *)0x22a77d;
      local_48a8._0_8_ = (pointer)0x12;
      local_48a8._8_8_ = 0;
      _Stack_4890._M_p = (pointer)0x0;
      pcVar27 = "too many arguments";
      local_48a8._16_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_48b8;
      do {
        pcVar18 = pcVar27 + 1;
        if (*pcVar27 == '}') {
          if ((pcVar18 == "") || (*pcVar18 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar18 = pcVar27 + 2;
        }
        else if (*pcVar27 == '{') {
          pcVar18 = ::fmt::v10::detail::
                    parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                              (pcVar27,"",(format_string_checker<char> *)local_48b8);
        }
        pcVar27 = pcVar18;
      } while (pcVar18 != "");
      args_03.field_1.args_ = in_R9.args_;
      args_03.desc_ = (unsigned_long_long)local_48b8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&local_4838,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),
                 args_03);
      local_4228._0_4_ = 2;
      p_Var47 = local_4210;
      local_4228._8_8_ = p_Var47;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_4228 + 8),local_4838._0_8_,
                 (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
      local_4058._0_4_ = local_4228._0_4_;
      _Stack_4050._M_p = (pointer)(local_4048 + 8);
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_4050,local_4228._8_8_,local_4218._M_p + local_4228._8_8_);
      local_4028 = (pointer)0x0;
      local_4020[0]._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
      local_4030._M_p = (pointer)local_4020;
      std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
      std::__cxx11::string::operator=(psVar7,(string *)&local_4030);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4030._M_p != local_4020) {
        operator_delete(local_4030._M_p);
      }
      p_Var28 = (_Alloc_hider *)local_4228._8_8_;
      if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
        operator_delete(_Stack_4050._M_p);
        p_Var28 = (_Alloc_hider *)local_4228._8_8_;
      }
      goto LAB_0011dffc;
    }
    JsonFromFile((Error *)local_4058,&local_47e8,pbVar44 + 2);
    local_4868._0_4_ = local_4058._0_4_;
    std::__cxx11::string::operator=((string *)&pbStack_4860,(string *)&_Stack_4050);
    uVar6 = local_4868._0_4_;
    if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
      operator_delete(_Stack_4050._M_p);
    }
    if (uVar6 != 0) {
      local_42b0._96_4_ = local_4868._0_4_;
      local_4248 = &local_4238;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_4248,pbStack_4860,
                 (char *)((long)&(pbStack_4860->_M_dataplus)._M_p + local_4858._0_8_));
      local_4058._0_4_ = local_42b0._96_4_;
      _Stack_4050._M_p = local_4048 + 8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&_Stack_4050,local_4248,(pointer)((long)local_4248 + (long)local_4240));
      local_4030._M_p = (pointer)local_4020;
      local_4028 = (pointer)0x0;
      local_4020[0]._M_local_buf[0] = '\0';
      Value::operator=(__return_storage_ptr__,(Value *)local_4058);
      Value::~Value((Value *)local_4058);
      uVar32 = local_4248;
      if (local_4248 != &local_4238) goto LAB_0011e017;
      goto LAB_0011e01c;
    }
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((input_adapter *)local_4058,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )local_47e8._M_dataplus._M_p,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(local_47e8._M_dataplus._M_p + local_47e8._M_string_length));
    local_4128 = (code *)0x0;
    uStack_4120 = 0;
    local_4138._M_unused._M_object = (void *)0x0;
    local_4138._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse(&local_40a8,(input_adapter *)local_4058,(parser_callback_t *)&local_4138,true);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_4778,&local_40a8);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::~basic_json(&local_40a8);
    if (local_4128 != (code *)0x0) {
      (*local_4128)(&local_4138,&local_4138,__destroy_functor);
    }
    if ((pointer)_Stack_4050._M_p != (pointer)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)_Stack_4050._M_p);
    }
    if (local_4778[0] == array) {
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::begin((iterator *)&local_4838,
              (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)local_4778);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::end((iterator *)&local_4808,
            (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_4778);
      while (bVar48 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator==((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                    *)&local_4838,
                                   (iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                                    *)&local_4808), !bVar48) {
        aJson = nlohmann::detail::
                iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                ::operator*((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                             *)&local_4838);
        BorderAgent::BorderAgent((BorderAgent *)local_4058);
        BorderAgentFromJson((BorderAgent *)local_4058,aJson);
        std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
        push_back(&local_47b8,(BorderAgent *)local_4058);
        BorderAgent::~BorderAgent((BorderAgent *)local_4058);
        nlohmann::detail::
        iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
        ::operator++((iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      *)&local_4838);
      }
    }
    else {
      BorderAgent::BorderAgent((BorderAgent *)local_4058);
      BorderAgentFromJson((BorderAgent *)local_4058,(json *)local_4778);
      std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
      push_back(&local_47b8,(value_type *)local_4058);
      BorderAgent::~BorderAgent((BorderAgent *)local_4058);
    }
    if (local_47b8.
        super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_47b8.
        super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      __last._M_current =
           local_47b8.
           super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
           ._M_impl.super__Vector_impl_data._M_start;
      do {
        psVar7 = local_4810;
        if ((~(__last._M_current)->mPresentFlags & 0x3f) == 0) {
          if ((__last._M_current)->mExtendedPanId == 0) {
            local_48b8 = (undefined1  [8])0x20000000d;
            pcVar27 = "XPAN required but not provided for border agent host:port {}:{}";
            jStack_48b0.object = (object_t *)0x22ceb1;
            local_48a8._0_8_ = 0x3f;
            local_48a8._8_8_ = 0x200000000;
            local_48a8._16_8_ = local_48b8;
            _Stack_4890._M_p =
                 (pointer)::fmt::v10::detail::
                          parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_4888 = ::fmt::v10::detail::
                         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_4808._M_allocated_capacity = local_48a8._16_8_;
            do {
              if (pcVar27 == "") break;
              pcVar18 = pcVar27;
              if (*pcVar27 == '{') {
LAB_0011f974:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                ::writer::operator()((writer *)&local_4808._M_allocated_capacity,pcVar27,pcVar18);
                pcVar27 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                                    (pcVar18,"",
                                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_48b8);
                bVar48 = true;
              }
              else {
                pcVar18 = pcVar27 + 1;
                bVar48 = pcVar18 != "";
                if (bVar48) {
                  if (*pcVar18 != '{') {
                    pcVar10 = pcVar27 + 2;
                    do {
                      pcVar18 = pcVar10;
                      bVar48 = pcVar18 != "";
                      if (pcVar18 == "") goto LAB_0011f970;
                      pcVar10 = pcVar18 + 1;
                    } while (*pcVar18 != '{');
                  }
                  bVar48 = true;
                }
LAB_0011f970:
                if (bVar48) goto LAB_0011f974;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                ::writer::operator()((writer *)&local_4808._M_allocated_capacity,pcVar27,"");
                bVar48 = false;
              }
            } while (bVar48);
            local_48b8 = (undefined1  [8])((__last._M_current)->mAddr)._M_dataplus._M_p;
            jStack_48b0 = (json_value)((__last._M_current)->mAddr)._M_string_length;
            local_48a8._0_8_ = ZEXT28((__last._M_current)->mPort);
            fmt_04.size_ = 0x2d;
            fmt_04.data_ = (char *)0x3f;
            args_16.field_1.values_ = in_R9.values_;
            args_16.desc_ = (unsigned_long_long)local_48b8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_4838,
                       (v10 *)"XPAN required but not provided for border agent host:port {}:{}",
                       fmt_04,args_16);
            local_46b0[0x10] = true;
            local_46b0[0x11] = (__atomic_base<bool>)0x0;
            local_46b0._18_2_ = 0;
            local_4698 = (element_type *)(local_4690 + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_4698,local_4838._0_8_,
                       (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
            local_4058._0_4_ = local_46b0._16_4_;
            _Stack_4050._M_p = local_4048 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4050,local_4698,
                       (undefined1 *)
                       ((long)&(local_4698->mJobPool).
                               super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + local_4690._0_8_));
            local_4028 = (pointer)0x0;
            local_4020[0]._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
            local_4030._M_p = (pointer)local_4020;
            std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
            std::__cxx11::string::operator=(psVar7,(string *)&local_4030);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4030._M_p != local_4020) {
              operator_delete(local_4030._M_p);
            }
            if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
              operator_delete(_Stack_4050._M_p);
            }
            peVar24 = (element_type *)(local_4690 + 8);
            _Var30._M_p = (pointer)local_4698;
            goto LAB_0011fd62;
          }
          local_4808._0_8_ = local_4808._0_8_ & 0xffffffffffffff00;
          __pred.iter._M_current = __last._M_current;
          __pred.flags = (anon_struct_1_3_c6cae716 *)&local_4808;
          _Var23 = std::
                   find_if<__gnu_cxx::__normal_iterator<ot::commissioner::BorderAgent*,std::vector<ot::commissioner::BorderAgent,std::allocator<ot::commissioner::BorderAgent>>>,ot::commissioner::Interpreter::ProcessBr(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__31>
                             ((__normal_iterator<ot::commissioner::BorderAgent_*,_std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>_>
                               )local_47b8.
                                super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                                ._M_impl.super__Vector_impl_data._M_start,__last,__pred);
          if (_Var23._M_current != __last._M_current) {
            if ((local_4808._0_8_ & 1) == 0) {
              if ((local_4808._0_8_ & 2) == 0) {
                uVar16 = 4;
                if ((local_4808._0_8_ & 4) != 0) {
                  ::fmt::v10::detail::
                  check_format_string<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                            ();
                  local_48b8 = (undefined1  [8])(__last._M_current)->mExtendedPanId;
                  local_48a8._0_8_ = ((__last._M_current)->mDomainName)._M_dataplus._M_p;
                  local_48a8._8_8_ = ((__last._M_current)->mDomainName)._M_string_length;
                  local_48a8._16_8_ = ((_Var23._M_current)->mDomainName)._M_dataplus._M_p;
                  _Stack_4890._M_p = (pointer)((_Var23._M_current)->mDomainName)._M_string_length;
                  fmt_05.size_ = 0xdd4;
                  fmt_05.data_ = (char *)0x59;
                  args_17.field_1.values_ = in_R9.values_;
                  args_17.desc_ = (unsigned_long_long)local_48b8;
                  ::fmt::v10::vformat_abi_cxx11_
                            ((string *)&local_4838,
                             (v10 *)
                             "Two inbound border agents have same XPAN \'{}\', but different domain names (\'{}\' and \'{}\')"
                             ,fmt_05,args_17);
                  local_4718 = 0x10;
                  local_4710 = (pointer)local_4700;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_4710,local_4838._0_8_,
                             (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
                  local_4058._0_4_ = local_4718;
                  _Stack_4050._M_p = local_4048 + 8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&_Stack_4050,local_4710,
                             (undefined1 *)
                             ((long)&(local_4708->_M_dataplus)._M_p +
                             (long)&(local_4710->_M_dataplus)._M_p));
                  local_4028 = (pointer)0x0;
                  local_4020[0]._M_local_buf[0] = '\0';
                  local_4030._M_p = (pointer)local_4020;
                  Value::operator=(__return_storage_ptr__,(Value *)local_4058);
                  Value::~Value((Value *)local_4058);
                  if (local_4710 != (pointer)local_4700) {
                    operator_delete(local_4710);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_4838._0_8_ != &local_4828) {
                    operator_delete((void *)local_4838._0_8_);
                  }
                }
                goto LAB_0011fd8b;
              }
              ::fmt::v10::detail::
              check_format_string<unsigned_long_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_48b8 = (undefined1  [8])(__last._M_current)->mExtendedPanId;
              local_48a8._0_8_ = ((__last._M_current)->mNetworkName)._M_dataplus._M_p;
              local_48a8._8_8_ = ((__last._M_current)->mNetworkName)._M_string_length;
              local_48a8._16_8_ = ((_Var23._M_current)->mNetworkName)._M_dataplus._M_p;
              _Stack_4890._M_p = (pointer)((_Var23._M_current)->mNetworkName)._M_string_length;
              fmt_06.size_ = 0xdd4;
              fmt_06.data_ = (char *)0x5a;
              args_18.field_1.values_ = in_R9.values_;
              args_18.desc_ = (unsigned_long_long)local_48b8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&local_4838,
                         (v10 *)
                         "Two inbound border agents have same XPAN \'{}\', but different network names (\'{}\' and \'{}\')"
                         ,fmt_06,args_18);
              local_4700._16_4_ = 0x10;
              local_4700._24_8_ = local_46d8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)(local_4700 + 0x18),local_4838._0_8_,
                         (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
              local_4058._0_4_ = local_4700._16_4_;
              _Stack_4050._M_p = local_4048 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4050,local_4700._24_8_,
                         (undefined1 *)
                         ((long)&(local_46e0->mJobPool).
                                 super__Vector_base<ot::commissioner::Job_*,_std::allocator<ot::commissioner::Job_*>_>
                                 ._M_impl.super__Vector_impl_data._M_start + local_4700._24_8_));
              local_4028 = (pointer)0x0;
              local_4020[0]._M_local_buf[0] = '\0';
              local_4030._M_p = (pointer)local_4020;
              Value::operator=(__return_storage_ptr__,(Value *)local_4058);
              Value::~Value((Value *)local_4058);
              peVar24 = (element_type *)local_46d8;
              _Var30._M_p = (pointer)local_4700._24_8_;
            }
            else {
              ::fmt::v10::detail::
              check_format_string<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short_&,_FMT_COMPILE_STRING,_0>
                        ();
              local_48b8 = (undefined1  [8])((__last._M_current)->mAddr)._M_dataplus._M_p;
              jStack_48b0 = (json_value)((__last._M_current)->mAddr)._M_string_length;
              local_48a8._0_8_ = ZEXT28((__last._M_current)->mPort);
              fmt_02.size_ = 0x2d;
              fmt_02.data_ = (char *)0x4a;
              args_14.field_1.values_ = in_R9.values_;
              args_14.desc_ = (unsigned_long_long)local_48b8;
              ::fmt::v10::vformat_abi_cxx11_
                        ((string *)&local_4838,
                         (v10 *)
                         "Address {} and port {} combination is not unique for inbound border agents"
                         ,fmt_02,args_14);
              local_46d8._16_4_ = 0x10;
              local_46c0._M_p = local_46b0;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_46c0,local_4838._0_8_,
                         (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
              local_4058._0_4_ = local_46d8._16_4_;
              _Stack_4050._M_p = local_4048 + 8;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&_Stack_4050,local_46c0._M_p,
                         local_46c0._M_p + (long)&(local_46b8._M_pi)->_vptr__Sp_counted_base);
              local_4028 = (pointer)0x0;
              local_4020[0]._M_local_buf[0] = '\0';
              local_4030._M_p = (pointer)local_4020;
              Value::operator=(__return_storage_ptr__,(Value *)local_4058);
              Value::~Value((Value *)local_4058);
              peVar24 = (element_type *)local_46b0;
              _Var30._M_p = local_46c0._M_p;
            }
            goto LAB_0011fd62;
          }
          uVar16 = 0;
        }
        else {
          local_48b8 = (undefined1  [8])0x200000002;
          pcVar27 = 
          "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})";
          jStack_48b0.object = (object_t *)0x22ce61;
          local_48a8._0_8_ = 0x4f;
          local_48a8._8_8_ = 0x200000000;
          local_48a8._16_8_ = local_48b8;
          _Stack_4890._M_p =
               (pointer)::fmt::v10::detail::
                        parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_4888 = ::fmt::v10::detail::
                       parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_4808._M_allocated_capacity = local_48a8._16_8_;
          do {
            if (pcVar27 == "") break;
            pcVar18 = pcVar27;
            if (*pcVar27 == '{') {
LAB_0011f73a:
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int>_>
              ::writer::operator()((writer *)&local_4808._M_allocated_capacity,pcVar27,pcVar18);
              pcVar27 = ::fmt::v10::detail::
                        parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int,unsigned_int>&>
                                  (pcVar18,"",
                                   (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                    *)local_48b8);
              bVar48 = true;
            }
            else {
              pcVar18 = pcVar27 + 1;
              bVar48 = pcVar18 != "";
              if (bVar48) {
                if (*pcVar18 != '{') {
                  pcVar10 = pcVar27 + 2;
                  do {
                    pcVar18 = pcVar10;
                    bVar48 = pcVar18 != "";
                    if (pcVar18 == "") goto LAB_0011f736;
                    pcVar10 = pcVar18 + 1;
                  } while (*pcVar18 != '{');
                }
                bVar48 = true;
              }
LAB_0011f736:
              if (bVar48) goto LAB_0011f73a;
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int,_unsigned_int>_>
              ::writer::operator()((writer *)&local_4808._M_allocated_capacity,pcVar27,"");
              bVar48 = false;
            }
          } while (bVar48);
          local_48b8 = (undefined1  [8])(ulong)(__last._M_current)->mPresentFlags;
          local_48a8._0_8_ = (pointer)0x3f;
          fmt_03.size_ = 0x22;
          fmt_03.data_ = (char *)0x4f;
          args_15.field_1.values_ = in_R9.values_;
          args_15.desc_ = (unsigned_long_long)local_48b8;
          ::fmt::v10::vformat_abi_cxx11_
                    ((string *)&local_4838,
                     (v10 *)
                     "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})"
                     ,fmt_03,args_15);
          local_4678 = 0x10;
          local_4670 = (element_type *)local_4660;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_4670,local_4838._0_8_,
                     (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
          local_4058._0_4_ = local_4678;
          _Stack_4050._M_p = local_4048 + 8;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&_Stack_4050,local_4670,local_4668._M_p + (long)local_4670);
          local_4028 = (pointer)0x0;
          local_4020[0]._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
          local_4030._M_p = (pointer)local_4020;
          std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
          std::__cxx11::string::operator=(psVar7,(string *)&local_4030);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4030._M_p != local_4020) {
            operator_delete(local_4030._M_p);
          }
          if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
            operator_delete(_Stack_4050._M_p);
          }
          peVar24 = (element_type *)local_4660;
          _Var30._M_p = (pointer)local_4670;
LAB_0011fd62:
          if ((element_type *)_Var30._M_p != peVar24) {
            operator_delete(_Var30._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_4838._0_8_ != &local_4828) {
            operator_delete((void *)local_4838._0_8_);
          }
          uVar16 = 4;
        }
LAB_0011fd8b:
        if (uVar16 != 0) goto LAB_0011fda9;
        __last._M_current = __last._M_current + 1;
      } while (__last._M_current !=
               local_47b8.
               super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    uVar16 = 0x1d;
LAB_0011fda9:
    pBVar41 = local_47b8.
              super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar16 == 0x1d) {
      if (local_47b8.
          super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_47b8.
          super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        aValue = local_47b8.
                 super__Vector_base<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          SVar11 = persistent_storage::Registry::Add
                             ((local_4840->mRegistry).
                              super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr,aValue);
          if (SVar11 == kSuccess) {
            uVar15 = 0;
          }
          else {
            local_48b8 = (undefined1  [8])0x20000000d;
            pcVar27 = "Insertion failure with border agent address {} and port {}";
            jStack_48b0.object = (object_t *)0x22cff1;
            local_48a8._0_8_ = 0x3a;
            local_48a8._8_8_ = 0x200000000;
            local_48a8._16_8_ = local_48b8;
            _Stack_4890._M_p =
                 (pointer)::fmt::v10::detail::
                          parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_4888 = ::fmt::v10::detail::
                         parse_format_specs<unsigned_short,fmt::v10::detail::compile_parse_context<char>>
            ;
            local_4808._M_allocated_capacity = local_48a8._16_8_;
            do {
              if (pcVar27 == "") break;
              pcVar18 = pcVar27;
              if (*pcVar27 == '{') {
LAB_0011fea5:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                ::writer::operator()((writer *)&local_4808._M_allocated_capacity,pcVar27,pcVar18);
                pcVar27 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,unsigned_short>&>
                                    (pcVar18,"",
                                     (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                      *)local_48b8);
                bVar48 = true;
              }
              else {
                pcVar18 = pcVar27 + 1;
                bVar48 = pcVar18 != "";
                if (bVar48) {
                  if (*pcVar18 != '{') {
                    pcVar10 = pcVar27 + 2;
                    do {
                      pcVar18 = pcVar10;
                      bVar48 = pcVar18 != "";
                      if (pcVar18 == "") goto LAB_0011fea1;
                      pcVar10 = pcVar18 + 1;
                    } while (*pcVar18 != '{');
                  }
                  bVar48 = true;
                }
LAB_0011fea1:
                if (bVar48) goto LAB_0011fea5;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_short>_>
                ::writer::operator()((writer *)&local_4808._M_allocated_capacity,pcVar27,"");
                bVar48 = false;
              }
            } while (bVar48);
            local_48b8 = (undefined1  [8])(aValue->mAddr)._M_dataplus._M_p;
            jStack_48b0 = (json_value)(aValue->mAddr)._M_string_length;
            local_48a8._0_8_ = ZEXT28(aValue->mPort);
            fmt_07.size_ = 0x2d;
            fmt_07.data_ = (char *)0x3a;
            args_19.field_1.args_ = in_R9.args_;
            args_19.desc_ = (unsigned_long_long)local_48b8;
            ::fmt::v10::vformat_abi_cxx11_
                      ((string *)&local_4838,
                       (v10 *)"Insertion failure with border agent address {} and port {}",fmt_07,
                       args_19);
            local_45f0 = 0x12;
            local_45e8 = (pointer)(local_45e0._M_local_buf + 8);
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_45e8,local_4838._0_8_,
                       (char *)(local_4838._8_8_ + local_4838._M_allocated_capacity));
            local_4058._0_4_ = local_45f0;
            _Stack_4050._M_p = local_4048 + 8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&_Stack_4050,local_45e8,
                       local_45e8 + local_45e0._M_allocated_capacity);
            local_4028 = (pointer)0x0;
            local_4020[0]._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_4058._0_4_;
            local_4030._M_p = (pointer)local_4020;
            std::__cxx11::string::operator=((string *)local_4818,(string *)&_Stack_4050);
            std::__cxx11::string::operator=(local_4810,(string *)&local_4030);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4030._M_p != local_4020) {
              operator_delete(local_4030._M_p);
            }
            if ((pointer)_Stack_4050._M_p != (pointer)(local_4048 + 8)) {
              operator_delete(_Stack_4050._M_p);
            }
            if (local_45e8 != (pointer)(local_45e0._M_local_buf + 8)) {
              operator_delete(local_45e8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_4838._0_8_ != &local_4828) {
              operator_delete((void *)local_4838._0_8_);
            }
            uVar15 = 4;
          }
          if (SVar11 != kSuccess) goto LAB_0012006d;
          aValue = aValue + 1;
        } while (aValue != pBVar41);
      }
      uVar15 = 0x26;
LAB_0012006d:
      uVar16 = 0;
      if (uVar15 != 0x26) {
        uVar16 = uVar15;
      }
    }
  }
  std::vector<ot::commissioner::BorderAgent,_std::allocator<ot::commissioner::BorderAgent>_>::
  ~vector(&local_47b8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_4778);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_4778 + 8),local_4778[0]);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_47e8._M_dataplus._M_p != &local_47e8.field_2) {
    operator_delete(local_47e8._M_dataplus._M_p);
  }
  if (pbStack_4860 != (pointer)(local_4858 + 8)) {
    operator_delete(pbStack_4860);
  }
  if ((uVar16 & 0x3b) == 0) {
    return __return_storage_ptr__;
  }
  if (*(undefined1 **)local_4810 != (undefined1 *)local_4660._72_8_) {
    operator_delete(*(undefined1 **)local_4810);
  }
  _Var30._M_p = ((_Alloc_hider *)&local_4818->_vptr_BorderAgent)->_M_p;
  if (_Var30._M_p == (pointer)local_4610._0_8_) {
    return __return_storage_ptr__;
  }
LAB_0011d21c:
  operator_delete(_Var30._M_p);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessBr(const Expression &aExpr)
{
    using namespace ot::commissioner::persistent_storage;

    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
    if (CaseInsensitiveEqual(aExpr[1], "list"))
    {
        nlohmann::json            json;
        std::vector<BorderRouter> routers;
        std::vector<Network>      networks;
        RegistryStatus            status;

        VerifyOrExit(aExpr.size() == 2, value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        if (mContext.mDomAliases.size() > 0)
        {
            for (const auto &dom : mContext.mDomAliases)
            {
                std::vector<Network> domNetworks;
                status = mRegistry->GetNetworksInDomain(dom, domNetworks);
                if (status != RegistryStatus::kSuccess)
                {
                    PrintNetworkMessage(dom, "domain name unknown", COLOR_ALIAS_FAILED);
                }
                else
                {
                    networks.insert(networks.end(), domNetworks.begin(), domNetworks.end());
                }
            }
        }
        else if (mContext.mNwkAliases.size() > 0)
        {
            StringArray unresolved;
            status = mRegistry->GetNetworksByAliases(mContext.mNwkAliases, networks, unresolved);
            // no need to announce unresolved items here as those were
            // displayed in the course of ValidateMultiNetworkSyntax()
            VerifyOrExit(status == RegistryStatus::kSuccess, value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
        }
        else
        {
            status = mRegistry->GetAllBorderRouters(routers);
            if (status != RegistryStatus::kSuccess && status != RegistryStatus::kNotFound)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR(RUNTIME_LOOKUP_FAILED));
            }
        }
        if (networks.size() > 0)
        {
            for (const auto &nwk : networks)
            {
                std::vector<BorderRouter> nwkRouters;
                status = mRegistry->GetBorderRoutersInNetwork(nwk.mXpan, nwkRouters);
                if (status == RegistryStatus::kSuccess)
                {
                    routers.insert(routers.end(), nwkRouters.begin(), nwkRouters.end());
                }
                else
                {
                    PrintNetworkMessage(nwk.mXpan, RUNTIME_LOOKUP_FAILED, COLOR_ALIAS_FAILED);
                }
            }
        }
        if (routers.size() > 0)
        {
            json  = routers;
            value = json.dump(JSON_INDENT_DEFAULT);
        }
        else
        {
            value = Value("[]");
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "add"))
    {
        Error                    error;
        std::string              jsonStr;
        nlohmann::json           json;
        std::vector<BorderAgent> agents;

        if (aExpr.size() < 3)
        {
            ExitNow(value = ERROR_INVALID_ARGS("input JSON file path required"));
        }
        else if (aExpr.size() > 3)
        {
            ExitNow(value = ERROR_INVALID_ARGS(SYNTAX_MANY_ARGS));
        }

        VerifyOrExit((error = JsonFromFile(jsonStr, aExpr[2])) == ERROR_NONE, value = Value(error));

        try
        {
            json = nlohmann::json::parse(jsonStr);
        } catch (std::exception &e)
        {
            ExitNow(value = ERROR_BAD_FORMAT("failed to parse JSON: {}", e.what()));
        }

        // Can be either single BorderAgent or an array of them.
        if (!json.is_array())
        {
            // Parse single BorderAgent
            BorderAgent ba;
            try
            {
                BorderAgentFromJson(ba, json);
            } catch (std::exception &e)
            {
                ExitNow(value = ERROR_BAD_FORMAT("incorrect border agent JSON format: {}", e.what()));
            }
            agents.push_back(ba);
        }
        else
        {
            for (const auto &jsonObject : json)
            {
                BorderAgent ba;
                try
                {
                    BorderAgentFromJson(ba, jsonObject);
                } catch (std::exception &e)
                {
                    ExitNow(value = ERROR_BAD_FORMAT("incorrect border agent JSON format: {}", e.what()));
                }
                agents.push_back(ba);
            }
        }
        // Sanity check of BorderAgent records
        for (auto iter = agents.begin(); iter != agents.end(); ++iter)
        {
            // Check mandatory fields present
            // By Thread 1.1.1 spec table 8-4
            constexpr const uint32_t kMandatoryFieldsBits =
                (BorderAgent::kAddrBit | BorderAgent::kPortBit | BorderAgent::kThreadVersionBit |
                 BorderAgent::kStateBit | BorderAgent::kNetworkNameBit | BorderAgent::kExtendedPanIdBit);
            if ((iter->mPresentFlags & kMandatoryFieldsBits) != kMandatoryFieldsBits)
            {
                ExitNow(value = ERROR_REJECTED(
                            "Missing mandatory border agent fields (fieldFlags = {:X}, expectedFlags = {:X})",
                            iter->mPresentFlags, kMandatoryFieldsBits));
            }

            // Check local network information sanity
            constexpr const uint32_t kNetworkInfoBits =
                (BorderAgent::kExtendedPanIdBit | BorderAgent::kNetworkNameBit | BorderAgent::kDomainNameBit);
            if (((iter->mPresentFlags & kNetworkInfoBits) != 0) &&
                (((iter->mPresentFlags & BorderAgent::kExtendedPanIdBit) == 0) || (iter->mExtendedPanId == 0)))
            {
                ExitNow(value = ERROR_REJECTED("XPAN required but not provided for border agent host:port {}:{}",
                                               iter->mAddr, iter->mPort));
            }

            // Sanity check across inbound data
            if (iter->mPresentFlags & BorderAgent::kExtendedPanIdBit)
            {
                struct
                {
                    bool addr : 1;
                    bool name : 1;
                    bool domain : 1;
                } flags = {false, false, false};

                // Network: (XPAN, PAN) combination must be same everywhere
                std::vector<BorderAgent>::iterator found =
                    std::find_if(agents.begin(), iter, [=, &flags](BorderAgent a) {
                        flags.addr = (iter->mAddr == a.mAddr && iter->mPort == a.mPort);
                        if (flags.addr)
                        {
                            return true;
                        }

#define CHECK_PRESENT_FLAG(record, flag) ((record).mPresentFlags & BorderAgent::k##flag##Bit)
                        if (CHECK_PRESENT_FLAG(a, ExtendedPanId) == 0)
                        {
                            return false;
                        }
                        flags.name = (CHECK_PRESENT_FLAG(a, NetworkName) != CHECK_PRESENT_FLAG(*iter, NetworkName)) ||
                                     ((CHECK_PRESENT_FLAG(*iter, NetworkName) != 0) &&
                                      iter->mExtendedPanId == a.mExtendedPanId && iter->mNetworkName != a.mNetworkName);
                        flags.domain = (CHECK_PRESENT_FLAG(a, DomainName) && CHECK_PRESENT_FLAG(*iter, DomainName)) &&
                                       (iter->mExtendedPanId == a.mExtendedPanId && iter->mDomainName != a.mDomainName);
                        return flags.name || flags.domain;
#undef CHECK_PRESENT_FLAG
                    });
                if (found != iter)
                {
                    if (flags.addr)
                    {
                        value =
                            ERROR_REJECTED("Address {} and port {} combination is not unique for inbound border agents",
                                           iter->mAddr, iter->mPort);
                    }
                    else if (flags.name)
                    {
                        value = ERROR_REJECTED("Two inbound border agents have same XPAN '{}', but different network "
                                               "names ('{}' and '{}')",
                                               iter->mExtendedPanId, iter->mNetworkName, found->mNetworkName);
                    }
                    else if (flags.domain)
                    {
                        value = ERROR_REJECTED(
                            "Two inbound border agents have same XPAN '{}', but different domain names ('{}' and '{}')",
                            iter->mExtendedPanId, iter->mDomainName, found->mDomainName);
                    }
                    ExitNow();
                }
            }
        }

        for (const auto &agent : agents)
        {
            auto status = mRegistry->Add(agent);
            if (status != RegistryStatus::kSuccess)
            {
                ExitNow(value = ERROR_REGISTRY_ERROR("Insertion failure with border agent address {} and port {}",
                                                     agent.mAddr, agent.mPort));
            }
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "delete"))
    {
        if (aExpr.size() > 3 || (aExpr.size() == 3 && !(mContext.mNwkAliases.empty() && mContext.mDomAliases.empty())))
        {
            ExitNow(value = ERROR_INVALID_ARGS("Too many arguments for `br delete` command`"));
        }
        else if (aExpr.size() == 3)
        {
            // Attempt to remove border agent by BorderRouterId
            BorderRouterId brId;
            try
            {
                brId = BorderRouterId(std::stoi(aExpr[2]));
            } catch (...)
            {
                ExitNow(value = ERROR_INVALID_ARGS("Failed to evaluate border router ID '{}'", aExpr[2]));
            }
            auto status = mRegistry->DeleteBorderRouterById(brId);
            if (status == RegistryStatus::kRestricted)
            {
                value = ERROR_REGISTRY_ERROR("Failed to delete border router ID {}: last router in the current network",
                                             aExpr[2]);
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value = ERROR_REGISTRY_ERROR("Failed to delete border router ID {}", aExpr[2]);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
        else if (mContext.mNwkAliases.size() > 0)
        {
            StringArray unresolved;
            // Remove all border agents in the networks
            auto status = mRegistry->DeleteBorderRoutersInNetworks(mContext.mNwkAliases, unresolved);
            if (status == RegistryStatus::kRestricted)
            {
                value = ERROR_REGISTRY_ERROR("Can't delete all border routers from the current network");
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value = Error(ErrorCode ::kIOError, "Failed to delete border routers");
            }
            // Report unresolved aliases
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
        else if (mContext.mDomAliases.size() > 0)
        {
            StringArray undeleted;
            // Remove all border agents in the domain
            auto status = mRegistry->DeleteBorderRoutersInDomain(mContext.mDomAliases[0]);
            if (status == RegistryStatus::kRestricted)
            {
                value =
                    ERROR_REGISTRY_ERROR("Failed to delete border routers in the domain '{}' of the current network",
                                         mContext.mDomAliases[0]);
            }
            else if (status != RegistryStatus::kSuccess)
            {
                value =
                    ERROR_REGISTRY_ERROR("Failed to delete border routers in the domain '{}'", mContext.mDomAliases[0]);
            }
            VerifyOrExit(status == RegistryStatus::kSuccess);
        }
    }
    else if (CaseInsensitiveEqual(aExpr[1], "scan"))
    {
        constexpr const mdns_record_type_t kMdnsQueryType  = MDNS_RECORDTYPE_PTR;
        constexpr const uint32_t           kMdnsBufferSize = 16 * 1024;
        const std::string                  kServiceName    = "_meshcop._udp.local";

        uint32_t                                  scanTimeout = 10000;
        std::string                               netIf       = "";
        int                                       mdnsSocket  = -1;
        FDGuard                                   fdgMdnsSocket;
        std::thread                               selectThread;
        event_base                               *base;
        timeval                                   tvTimeout;
        std::unique_ptr<event, void (*)(event *)> mdnsEvent(nullptr, event_free);
        std::unique_ptr<event, void (*)(event *)> cancelEvent(nullptr, event_free);
        std::vector<BorderAgentOrErrorMsg>        borderAgents;
        nlohmann::json                            baJson;
        char                                      mdnsSendBuffer[kMdnsBufferSize];
        int                                       rval = 0;

        auto it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--timeout");
        if (it != mContext.mCommandKeys.end())
        {
            if (++it != mContext.mCommandKeys.end())
            {
                SuccessOrExit(value = ParseInteger(scanTimeout, it[0]));
            }
            else
            {
                ExitNow(value = ERROR_INVALID_ARGS("Missing --timeout value"));
            }
        }

        it = std::find(mContext.mCommandKeys.begin(), mContext.mCommandKeys.end(), "--netif");
        if (it != mContext.mCommandKeys.end())
        {
            if (++it != mContext.mCommandKeys.end())
            {
                netIf = it[0];
            }
            else
            {
                ExitNow(value = ERROR_INVALID_ARGS("Missing --netif value"));
            }
        }

        // Open IPv4 mDNS socket
        mdnsSocket = mdns_socket_open_ipv4();
        VerifyOrExit(mdnsSocket >= 0, value = ERROR_IO_ERROR("failed to open mDNS IPv4 socket"));

        if (!netIf.empty())
        {
#ifdef __linux__
            rval = setsockopt(mdnsSocket, SOL_SOCKET, SO_BINDTODEVICE, netIf.c_str(), netIf.size());
#else  // __NetBSD__ || __FreeBSD__ || __APPLE__
            rval = setsockopt(mdnsSocket, IPPROTO_IPV6, IP_BOUND_IF, netIf.c_str(), netIf.size());
#endif // __linux__
            VerifyOrExit(rval == 0,
                         value = ERROR_INVALID_ARGS("failed to bind network interface {}: {}", netIf, strerror(errno)));
        }

        fdgMdnsSocket.mFD = mdnsSocket;

        //  Initialize event library
        base = event_base_new();

        // Instantly register timeout event to stop the event loop
        evutil_timerclear(&tvTimeout);
        tvTimeout.tv_sec  = scanTimeout / 1000;
        tvTimeout.tv_usec = (scanTimeout % 1000) * 1000;
        event_base_loopexit(base, &tvTimeout);

        // Register event for inbound events on mdnsSocket
        // The mdnsSocket is already non-blocking (as we need for the event library)
        auto mdnsReaderParser = [](evutil_socket_t aSocket, short aWhat, void *aArg) {
            (void)aWhat;

            BorderAgentOrErrorMsg               agent;
            char                                buf[1024 * 16];
            std::vector<BorderAgentOrErrorMsg> &agents = *static_cast<std::vector<BorderAgentOrErrorMsg> *>(aArg);

            mdns_query_recv(aSocket, buf, sizeof(buf), HandleRecord, &agent, 1);
            agents.push_back(agent);

            return;
        };
        mdnsEvent = std::unique_ptr<event, void (*)(event *)>(
            event_new(base, mdnsSocket, EV_READ | EV_PERSIST, mdnsReaderParser, &borderAgents), event_free);
        event_add(mdnsEvent.get(), nullptr);

        // Stop event queue on data in the mCancelPipe
        auto mdnsCancelEventQueue = [](evutil_socket_t aSocket, short aWhat, void *aArg) {
            (void)aSocket;
            (void)aWhat;
            event_base *ev_base = static_cast<event_base *>(aArg);
            event_base_loopbreak(ev_base);
        };
        // Attach cancel pipe to event loop. When bytes written to the
        // pipe, mdnsCancelEventQueue() lambda is invoked resulting in
        // breaking event loop
        cancelEvent = std::unique_ptr<event, void (*)(event *)>(
            event_new(base, mCancelPipe[0], EV_READ | EV_PERSIST, mdnsCancelEventQueue, base), event_free);
        event_add(cancelEvent.get(), nullptr);

        // Start event loop thread
        selectThread = std::thread([](event_base *aBase) { event_base_dispatch(aBase); }, base);

        // Send mDNS query
        if (mdns_query_send(mdnsSocket, kMdnsQueryType, kServiceName.c_str(), kServiceName.length(), mdnsSendBuffer,
                            sizeof(mdnsSendBuffer)) != 0)
        {
            // Stop event thread
            event_base_loopbreak(base);
            selectThread.join();
            ExitNow(value = ERROR_IO_ERROR("Sending mDNS query failed"));
        }
        // Join the waiting (event loop) thread
        selectThread.join();

        if (mCancelCommand)
        {
            int cancelData;
            while (read(mCancelPipe[0], &cancelData, sizeof(cancelData)) != -1)
                ;
            ExitNow(value = ERROR_CANCELLED("Scan cancelled by user"));
        }

        std::vector<uint64_t> xpans;
        StringArray           unresolved;
        if (!mContext.mNwkAliases.empty())
        {
            VerifyOrExit(mRegistry->GetNetworkXpansByAliases(mContext.mNwkAliases, xpans, unresolved) ==
                             RegistryStatus::kSuccess,
                         value = ERROR_REGISTRY_ERROR("Failed to convert network aliases to XPAN IDs"));
            for (const auto &alias : unresolved)
            {
                PrintNetworkMessage(alias, RUNTIME_RESOLVING_FAILED, COLOR_ALIAS_FAILED);
            }
            VerifyOrExit(!xpans.empty(),
                         value = ERROR_NOT_FOUND(
                             "No known extended PAN ID discovered for network aliases. Please make complete rescan."));
        }

        // Serialize BorderAgents to JSON into value
        for (const auto &agentOrError : borderAgents)
        {
            if (agentOrError.mError != ErrorCode::kNone)
            {
                Console::Write(agentOrError.mError.GetMessage(), Console::Color::kRed);
            }
            else
            {
                nlohmann::json ba;
                BorderAgentToJson(agentOrError.mBorderAgent, ba);
                if ((mContext.mNwkAliases.empty() && mContext.mDomAliases.empty()) ||
                    (!mContext.mDomAliases.empty() &&
                     (agentOrError.mBorderAgent.mPresentFlags & BorderAgent::kDomainNameBit) &&
                     (agentOrError.mBorderAgent.mDomainName == mContext.mDomAliases[0])) ||
                    (!mContext.mNwkAliases.empty() &&
                     (agentOrError.mBorderAgent.mPresentFlags & BorderAgent::kExtendedPanIdBit) &&
                     (std::find(xpans.begin(), xpans.end(), agentOrError.mBorderAgent.mExtendedPanId) != xpans.end())))
                {
                    baJson.push_back(ba);
                }
            }
        }
        value = baJson.dump(JSON_INDENT_DEFAULT);
    }
    else
    {
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]));
    }

exit:
    return value;
}